

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx512::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  int iVar8;
  undefined4 uVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  int iVar59;
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  Geometry *pGVar62;
  byte bVar63;
  ulong uVar64;
  uint uVar65;
  uint uVar66;
  long lVar67;
  long lVar68;
  Geometry *pGVar69;
  uint uVar70;
  ulong uVar71;
  byte bVar72;
  ulong uVar73;
  ulong uVar74;
  float fVar75;
  float fVar125;
  float fVar127;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar76;
  undefined1 auVar84 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar126;
  float fVar128;
  float fVar130;
  float fVar131;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  float fVar129;
  float fVar132;
  float fVar133;
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined4 uVar134;
  float fVar151;
  float fVar152;
  vint4 bi_2;
  undefined1 auVar135 [16];
  float fVar153;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined8 uVar154;
  vint4 bi_1;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [32];
  float fVar160;
  float fVar161;
  float fVar173;
  vint4 bi;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 ai_2;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  vint4 ai_1;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [64];
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [64];
  undefined1 auVar204 [64];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar215 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [64];
  undefined1 auVar222 [16];
  undefined1 auVar223 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5f0 [16];
  Precalculations *local_5d8;
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [8];
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_588;
  Geometry *local_558;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  LinearSpace3fa *local_528;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  int local_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined1 local_410 [16];
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_190 [16];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar216 [32];
  
  PVar6 = prim[1];
  uVar64 = (ulong)(byte)PVar6;
  lVar28 = uVar64 * 0x25;
  fVar161 = *(float *)(prim + lVar28 + 0x12);
  auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar78 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar78 = vinsertps_avx(auVar78,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar77 = vsubps_avx(auVar77,*(undefined1 (*) [16])(prim + lVar28 + 6));
  auVar174._0_4_ = fVar161 * auVar77._0_4_;
  auVar174._4_4_ = fVar161 * auVar77._4_4_;
  auVar174._8_4_ = fVar161 * auVar77._8_4_;
  auVar174._12_4_ = fVar161 * auVar77._12_4_;
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 4 + 6)));
  auVar135._0_4_ = fVar161 * auVar78._0_4_;
  auVar135._4_4_ = fVar161 * auVar78._4_4_;
  auVar135._8_4_ = fVar161 * auVar78._8_4_;
  auVar135._12_4_ = fVar161 * auVar78._12_4_;
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 5 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 6 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0xf + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar64 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1a + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1b + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar64 * 0x1c + 6)));
  auVar26 = vcvtdq2ps_avx(auVar26);
  auVar191._4_4_ = auVar135._0_4_;
  auVar191._0_4_ = auVar135._0_4_;
  auVar191._8_4_ = auVar135._0_4_;
  auVar191._12_4_ = auVar135._0_4_;
  auVar82 = vshufps_avx(auVar135,auVar135,0x55);
  auVar220 = vshufps_avx(auVar135,auVar135,0xaa);
  fVar161 = auVar220._0_4_;
  auVar162._0_4_ = fVar161 * auVar20._0_4_;
  fVar151 = auVar220._4_4_;
  auVar162._4_4_ = fVar151 * auVar20._4_4_;
  fVar152 = auVar220._8_4_;
  auVar162._8_4_ = fVar152 * auVar20._8_4_;
  fVar153 = auVar220._12_4_;
  auVar162._12_4_ = fVar153 * auVar20._12_4_;
  auVar155._0_4_ = auVar23._0_4_ * fVar161;
  auVar155._4_4_ = auVar23._4_4_ * fVar151;
  auVar155._8_4_ = auVar23._8_4_ * fVar152;
  auVar155._12_4_ = auVar23._12_4_ * fVar153;
  auVar136._0_4_ = auVar26._0_4_ * fVar161;
  auVar136._4_4_ = auVar26._4_4_ * fVar151;
  auVar136._8_4_ = auVar26._8_4_ * fVar152;
  auVar136._12_4_ = auVar26._12_4_ * fVar153;
  auVar220 = vfmadd231ps_fma(auVar162,auVar82,auVar78);
  auVar222 = vfmadd231ps_fma(auVar155,auVar82,auVar22);
  auVar82 = vfmadd231ps_fma(auVar136,auVar25,auVar82);
  auVar83 = vfmadd231ps_fma(auVar220,auVar191,auVar77);
  auVar222 = vfmadd231ps_fma(auVar222,auVar191,auVar21);
  auVar84 = vfmadd231ps_fma(auVar82,auVar24,auVar191);
  auVar213._4_4_ = auVar174._0_4_;
  auVar213._0_4_ = auVar174._0_4_;
  auVar213._8_4_ = auVar174._0_4_;
  auVar213._12_4_ = auVar174._0_4_;
  auVar82 = vshufps_avx(auVar174,auVar174,0x55);
  auVar220 = vshufps_avx(auVar174,auVar174,0xaa);
  fVar161 = auVar220._0_4_;
  auVar192._0_4_ = fVar161 * auVar20._0_4_;
  fVar151 = auVar220._4_4_;
  auVar192._4_4_ = fVar151 * auVar20._4_4_;
  fVar152 = auVar220._8_4_;
  auVar192._8_4_ = fVar152 * auVar20._8_4_;
  fVar153 = auVar220._12_4_;
  auVar192._12_4_ = fVar153 * auVar20._12_4_;
  auVar184._0_4_ = auVar23._0_4_ * fVar161;
  auVar184._4_4_ = auVar23._4_4_ * fVar151;
  auVar184._8_4_ = auVar23._8_4_ * fVar152;
  auVar184._12_4_ = auVar23._12_4_ * fVar153;
  auVar175._0_4_ = auVar26._0_4_ * fVar161;
  auVar175._4_4_ = auVar26._4_4_ * fVar151;
  auVar175._8_4_ = auVar26._8_4_ * fVar152;
  auVar175._12_4_ = auVar26._12_4_ * fVar153;
  auVar78 = vfmadd231ps_fma(auVar192,auVar82,auVar78);
  auVar20 = vfmadd231ps_fma(auVar184,auVar82,auVar22);
  auVar22 = vfmadd231ps_fma(auVar175,auVar82,auVar25);
  auVar30 = vfmadd231ps_fma(auVar78,auVar213,auVar77);
  auVar135 = vfmadd231ps_fma(auVar20,auVar213,auVar21);
  auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar221 = ZEXT1664(auVar77);
  auVar136 = vfmadd231ps_fma(auVar22,auVar213,auVar24);
  auVar78 = vandps_avx512vl(auVar83,auVar77);
  auVar201._8_4_ = 0x219392ef;
  auVar201._0_8_ = 0x219392ef219392ef;
  auVar201._12_4_ = 0x219392ef;
  uVar71 = vcmpps_avx512vl(auVar78,auVar201,1);
  bVar14 = (bool)((byte)uVar71 & 1);
  auVar79._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar83._0_4_;
  bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar79._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar83._4_4_;
  bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar79._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar83._8_4_;
  bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar79._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar83._12_4_;
  auVar78 = vandps_avx512vl(auVar222,auVar77);
  uVar71 = vcmpps_avx512vl(auVar78,auVar201,1);
  bVar14 = (bool)((byte)uVar71 & 1);
  auVar80._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar222._0_4_;
  bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar222._4_4_;
  bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar222._8_4_;
  bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar222._12_4_;
  auVar77 = vandps_avx512vl(auVar84,auVar77);
  uVar71 = vcmpps_avx512vl(auVar77,auVar201,1);
  bVar14 = (bool)((byte)uVar71 & 1);
  auVar81._0_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar84._0_4_;
  bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar84._4_4_;
  bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar84._8_4_;
  bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar14 * 0x219392ef | (uint)!bVar14 * auVar84._12_4_;
  auVar78 = vrcp14ps_avx512vl(auVar79);
  auVar202._8_4_ = 0x3f800000;
  auVar202._0_8_ = 0x3f8000003f800000;
  auVar202._12_4_ = 0x3f800000;
  auVar77 = vfnmadd213ps_fma(auVar79,auVar78,auVar202);
  auVar83 = vfmadd132ps_fma(auVar77,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar80);
  auVar77 = vfnmadd213ps_fma(auVar80,auVar78,auVar202);
  auVar84 = vfmadd132ps_fma(auVar77,auVar78,auVar78);
  auVar78 = vrcp14ps_avx512vl(auVar81);
  auVar77 = vfnmadd213ps_fma(auVar81,auVar78,auVar202);
  auVar29 = vfmadd132ps_fma(auVar77,auVar78,auVar78);
  fVar161 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar28 + 0x16)) *
            *(float *)(prim + lVar28 + 0x1a);
  auVar199._4_4_ = fVar161;
  auVar199._0_4_ = fVar161;
  auVar199._8_4_ = fVar161;
  auVar199._12_4_ = fVar161;
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar64 * 7 + 6);
  auVar77 = vpmovsxwd_avx(auVar77);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar64 * 0xb + 6);
  auVar78 = vpmovsxwd_avx(auVar78);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar21 = vsubps_avx(auVar78,auVar77);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar64 * 9 + 6);
  auVar78 = vpmovsxwd_avx(auVar20);
  auVar20 = vfmadd213ps_fma(auVar21,auVar199,auVar77);
  auVar77 = vcvtdq2ps_avx(auVar78);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar64 * 0xd + 6);
  auVar78 = vpmovsxwd_avx(auVar21);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar77);
  auVar21 = vfmadd213ps_fma(auVar78,auVar199,auVar77);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar64 * 0x12 + 6);
  auVar77 = vpmovsxwd_avx(auVar22);
  auVar77 = vcvtdq2ps_avx(auVar77);
  uVar71 = (ulong)(uint)((int)(uVar64 * 5) << 2);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar64 * 2 + uVar71 + 6);
  auVar78 = vpmovsxwd_avx(auVar23);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar77);
  auVar22 = vfmadd213ps_fma(auVar78,auVar199,auVar77);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar71 + 6);
  auVar77 = vpmovsxwd_avx(auVar24);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar64 * 0x18 + 6);
  auVar78 = vpmovsxwd_avx(auVar25);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar77);
  auVar23 = vfmadd213ps_fma(auVar78,auVar199,auVar77);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar64 * 0x1d + 6);
  auVar77 = vpmovsxwd_avx(auVar26);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar64 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar78 = vpmovsxwd_avx(auVar82);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar77);
  auVar24 = vfmadd213ps_fma(auVar78,auVar199,auVar77);
  auVar220._8_8_ = 0;
  auVar220._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar64) + 6);
  auVar77 = vpmovsxwd_avx(auVar220);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar222._8_8_ = 0;
  auVar222._0_8_ = *(ulong *)(prim + uVar64 * 0x23 + 6);
  auVar78 = vpmovsxwd_avx(auVar222);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar78 = vsubps_avx(auVar78,auVar77);
  auVar78 = vfmadd213ps_fma(auVar78,auVar199,auVar77);
  auVar77 = vsubps_avx(auVar20,auVar30);
  auVar200._0_4_ = auVar83._0_4_ * auVar77._0_4_;
  auVar200._4_4_ = auVar83._4_4_ * auVar77._4_4_;
  auVar200._8_4_ = auVar83._8_4_ * auVar77._8_4_;
  auVar200._12_4_ = auVar83._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar21,auVar30);
  auVar163._0_4_ = auVar83._0_4_ * auVar77._0_4_;
  auVar163._4_4_ = auVar83._4_4_ * auVar77._4_4_;
  auVar163._8_4_ = auVar83._8_4_ * auVar77._8_4_;
  auVar163._12_4_ = auVar83._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar22,auVar135);
  auVar193._0_4_ = auVar84._0_4_ * auVar77._0_4_;
  auVar193._4_4_ = auVar84._4_4_ * auVar77._4_4_;
  auVar193._8_4_ = auVar84._8_4_ * auVar77._8_4_;
  auVar193._12_4_ = auVar84._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar23,auVar135);
  auVar156._0_4_ = auVar84._0_4_ * auVar77._0_4_;
  auVar156._4_4_ = auVar84._4_4_ * auVar77._4_4_;
  auVar156._8_4_ = auVar84._8_4_ * auVar77._8_4_;
  auVar156._12_4_ = auVar84._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar24,auVar136);
  auVar185._0_4_ = auVar29._0_4_ * auVar77._0_4_;
  auVar185._4_4_ = auVar29._4_4_ * auVar77._4_4_;
  auVar185._8_4_ = auVar29._8_4_ * auVar77._8_4_;
  auVar185._12_4_ = auVar29._12_4_ * auVar77._12_4_;
  auVar77 = vsubps_avx(auVar78,auVar136);
  auVar137._0_4_ = auVar29._0_4_ * auVar77._0_4_;
  auVar137._4_4_ = auVar29._4_4_ * auVar77._4_4_;
  auVar137._8_4_ = auVar29._8_4_ * auVar77._8_4_;
  auVar137._12_4_ = auVar29._12_4_ * auVar77._12_4_;
  auVar77 = vpminsd_avx(auVar200,auVar163);
  auVar78 = vpminsd_avx(auVar193,auVar156);
  auVar77 = vmaxps_avx(auVar77,auVar78);
  auVar78 = vpminsd_avx(auVar185,auVar137);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar83._4_4_ = uVar134;
  auVar83._0_4_ = uVar134;
  auVar83._8_4_ = uVar134;
  auVar83._12_4_ = uVar134;
  auVar78 = vmaxps_avx512vl(auVar78,auVar83);
  auVar77 = vmaxps_avx(auVar77,auVar78);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  local_190 = vmulps_avx512vl(auVar77,auVar84);
  auVar77 = vpmaxsd_avx(auVar200,auVar163);
  auVar78 = vpmaxsd_avx(auVar193,auVar156);
  auVar77 = vminps_avx(auVar77,auVar78);
  auVar78 = vpmaxsd_avx(auVar185,auVar137);
  uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar29._4_4_ = uVar134;
  auVar29._0_4_ = uVar134;
  auVar29._8_4_ = uVar134;
  auVar29._12_4_ = uVar134;
  auVar78 = vminps_avx512vl(auVar78,auVar29);
  auVar77 = vminps_avx(auVar77,auVar78);
  auVar30._8_4_ = 0x3f800003;
  auVar30._0_8_ = 0x3f8000033f800003;
  auVar30._12_4_ = 0x3f800003;
  auVar77 = vmulps_avx512vl(auVar77,auVar30);
  auVar78 = vpbroadcastd_avx512vl();
  uVar154 = vcmpps_avx512vl(local_190,auVar77,2);
  uVar71 = vpcmpgtd_avx512vl(auVar78,_DAT_01f7fcf0);
  uVar71 = ((byte)uVar154 & 0xf) & uVar71;
  if ((char)uVar71 != '\0') {
    local_528 = pre->ray_space + k;
    local_4d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
    auVar223 = ZEXT1664(auVar77);
    local_5d8 = pre;
    do {
      lVar28 = 0;
      for (uVar64 = uVar71; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
        lVar28 = lVar28 + 1;
      }
      uVar70 = *(uint *)(prim + 2);
      uVar7 = *(uint *)(prim + lVar28 * 4 + 6);
      pGVar69 = (context->scene->geometries).items[uVar70].ptr;
      uVar64 = (ulong)*(uint *)(*(long *)&pGVar69->field_0x58 +
                               (ulong)uVar7 *
                               pGVar69[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar161 = (pGVar69->time_range).lower;
      fVar161 = pGVar69->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x70) - fVar161) /
                ((pGVar69->time_range).upper - fVar161));
      auVar77 = vroundss_avx(ZEXT416((uint)fVar161),ZEXT416((uint)fVar161),9);
      auVar78 = vaddss_avx512f(ZEXT416((uint)pGVar69->fnumTimeSegments),
                               SUB6416(ZEXT464(0xbf800000),0));
      auVar77 = vminss_avx(auVar77,auVar78);
      auVar77 = vmaxss_avx(ZEXT816(0) << 0x20,auVar77);
      fVar161 = fVar161 - auVar77._0_4_;
      fVar151 = 1.0 - fVar161;
      _Var10 = pGVar69[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar67 = (long)(int)auVar77._0_4_ * 0x38;
      lVar68 = *(long *)(_Var10 + 0x10 + lVar67);
      lVar11 = *(long *)(_Var10 + 0x38 + lVar67);
      lVar12 = *(long *)(_Var10 + 0x48 + lVar67);
      auVar138._4_4_ = fVar161;
      auVar138._0_4_ = fVar161;
      auVar138._8_4_ = fVar161;
      auVar138._12_4_ = fVar161;
      pfVar3 = (float *)(lVar11 + lVar12 * uVar64);
      auVar205._0_4_ = fVar161 * *pfVar3;
      auVar205._4_4_ = fVar161 * pfVar3[1];
      auVar205._8_4_ = fVar161 * pfVar3[2];
      auVar205._12_4_ = fVar161 * pfVar3[3];
      lVar28 = uVar64 + 1;
      auVar77 = vmulps_avx512vl(auVar138,*(undefined1 (*) [16])(lVar11 + lVar12 * lVar28));
      p_Var13 = pGVar69[4].occlusionFilterN;
      auVar157._4_4_ = fVar151;
      auVar157._0_4_ = fVar151;
      auVar157._8_4_ = fVar151;
      auVar157._12_4_ = fVar151;
      local_5a0 = vfmadd231ps_fma(auVar205,auVar157,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var10 + lVar67) + lVar68 * uVar64));
      _local_5b0 = vfmadd231ps_avx512vl
                             (auVar77,auVar157,
                              *(undefined1 (*) [16])(*(long *)(_Var10 + lVar67) + lVar68 * lVar28));
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar67 + 0x38) +
                        uVar64 * *(long *)(p_Var13 + lVar67 + 0x48));
      auVar206._0_4_ = fVar161 * *pfVar3;
      auVar206._4_4_ = fVar161 * pfVar3[1];
      auVar206._8_4_ = fVar161 * pfVar3[2];
      auVar206._12_4_ = fVar161 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar67 + 0x38) +
                        *(long *)(p_Var13 + lVar67 + 0x48) * lVar28);
      auVar210._0_4_ = fVar161 * *pfVar3;
      auVar210._4_4_ = fVar161 * pfVar3[1];
      auVar210._8_4_ = fVar161 * pfVar3[2];
      auVar210._12_4_ = fVar161 * pfVar3[3];
      auVar78 = vfmadd231ps_fma(auVar206,auVar157,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var13 + lVar67) +
                                 *(long *)(p_Var13 + lVar67 + 0x10) * uVar64));
      auVar20 = vfmadd231ps_fma(auVar210,auVar157,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var13 + lVar67) +
                                 *(long *)(p_Var13 + lVar67 + 0x10) * lVar28));
      iVar8 = (int)pGVar69[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar77 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10))
                              ,0x1c);
      auVar77 = vinsertps_avx(auVar77,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
      lVar28 = (long)iVar8 * 0x44;
      auVar222 = auVar223._0_16_;
      local_5c0 = vfnmadd213ps_avx512vl(auVar78,auVar222,local_5a0);
      local_5d0 = vfmadd213ps_avx512vl(auVar20,auVar222,_local_5b0);
      auVar20 = vsubps_avx(local_5a0,auVar77);
      uVar134 = auVar20._0_4_;
      auVar164._4_4_ = uVar134;
      auVar164._0_4_ = uVar134;
      auVar164._8_4_ = uVar134;
      auVar164._12_4_ = uVar134;
      auVar78 = vshufps_avx(auVar20,auVar20,0x55);
      aVar4 = (local_528->vx).field_0;
      aVar5 = (local_528->vy).field_0;
      fVar161 = (local_528->vz).field_0.m128[0];
      fVar151 = *(float *)((long)&(local_528->vz).field_0 + 4);
      fVar152 = *(float *)((long)&(local_528->vz).field_0 + 8);
      fVar153 = *(float *)((long)&(local_528->vz).field_0 + 0xc);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar209._0_4_ = fVar161 * auVar20._0_4_;
      auVar209._4_4_ = fVar151 * auVar20._4_4_;
      auVar209._8_4_ = fVar152 * auVar20._8_4_;
      auVar209._12_4_ = fVar153 * auVar20._12_4_;
      auVar78 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar5,auVar78);
      auVar21 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar164);
      auVar20 = vsubps_avx(local_5c0,auVar77);
      uVar134 = auVar20._0_4_;
      auVar165._4_4_ = uVar134;
      auVar165._0_4_ = uVar134;
      auVar165._8_4_ = uVar134;
      auVar165._12_4_ = uVar134;
      auVar78 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar211._0_4_ = fVar161 * auVar20._0_4_;
      auVar211._4_4_ = fVar151 * auVar20._4_4_;
      auVar211._8_4_ = fVar152 * auVar20._8_4_;
      auVar211._12_4_ = fVar153 * auVar20._12_4_;
      auVar78 = vfmadd231ps_fma(auVar211,(undefined1  [16])aVar5,auVar78);
      auVar22 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar165);
      auVar20 = vsubps_avx(local_5d0,auVar77);
      uVar134 = auVar20._0_4_;
      auVar166._4_4_ = uVar134;
      auVar166._0_4_ = uVar134;
      auVar166._8_4_ = uVar134;
      auVar166._12_4_ = uVar134;
      auVar78 = vshufps_avx(auVar20,auVar20,0x55);
      auVar20 = vshufps_avx(auVar20,auVar20,0xaa);
      auVar212._0_4_ = fVar161 * auVar20._0_4_;
      auVar212._4_4_ = fVar151 * auVar20._4_4_;
      auVar212._8_4_ = fVar152 * auVar20._8_4_;
      auVar212._12_4_ = fVar153 * auVar20._12_4_;
      auVar78 = vfmadd231ps_fma(auVar212,(undefined1  [16])aVar5,auVar78);
      auVar20 = vfmadd231ps_fma(auVar78,(undefined1  [16])aVar4,auVar166);
      auVar78 = vsubps_avx512vl(_local_5b0,auVar77);
      uVar134 = auVar78._0_4_;
      auVar158._4_4_ = uVar134;
      auVar158._0_4_ = uVar134;
      auVar158._8_4_ = uVar134;
      auVar158._12_4_ = uVar134;
      auVar77 = vshufps_avx(auVar78,auVar78,0x55);
      auVar78 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar214._0_4_ = fVar161 * auVar78._0_4_;
      auVar214._4_4_ = fVar151 * auVar78._4_4_;
      auVar214._8_4_ = fVar152 * auVar78._8_4_;
      auVar214._12_4_ = fVar153 * auVar78._12_4_;
      auVar77 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar5,auVar77);
      auVar23 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar158);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar28);
      uVar134 = auVar21._0_4_;
      local_2e0._4_4_ = uVar134;
      local_2e0._0_4_ = uVar134;
      local_2e0._8_4_ = uVar134;
      local_2e0._12_4_ = uVar134;
      local_2e0._16_4_ = uVar134;
      local_2e0._20_4_ = uVar134;
      local_2e0._24_4_ = uVar134;
      local_2e0._28_4_ = uVar134;
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x484);
      auVar85._8_4_ = 1;
      auVar85._0_8_ = 0x100000001;
      auVar85._12_4_ = 1;
      auVar85._16_4_ = 1;
      auVar85._20_4_ = 1;
      auVar85._24_4_ = 1;
      auVar85._28_4_ = 1;
      local_300 = vpermps_avx2(auVar85,ZEXT1632(auVar21));
      uVar134 = auVar22._0_4_;
      auVar176._4_4_ = uVar134;
      auVar176._0_4_ = uVar134;
      auVar176._8_4_ = uVar134;
      auVar176._12_4_ = uVar134;
      local_320._16_4_ = uVar134;
      local_320._0_16_ = auVar176;
      local_320._20_4_ = uVar134;
      local_320._24_4_ = uVar134;
      local_320._28_4_ = uVar134;
      local_340 = vpermps_avx512vl(auVar85,ZEXT1632(auVar22));
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x908);
      local_360 = vbroadcastss_avx512vl(auVar20);
      local_380 = vpermps_avx512vl(auVar85,ZEXT1632(auVar20));
      auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0xd8c);
      uVar134 = auVar23._0_4_;
      local_3a0._4_4_ = uVar134;
      local_3a0._0_4_ = uVar134;
      fStack_398 = (float)uVar134;
      fStack_394 = (float)uVar134;
      fStack_390 = (float)uVar134;
      fStack_38c = (float)uVar134;
      fStack_388 = (float)uVar134;
      register0x0000139c = uVar134;
      _local_3c0 = vpermps_avx512vl(auVar85,ZEXT1632(auVar23));
      auVar85 = vmulps_avx512vl(_local_3a0,auVar97);
      auVar86 = vmulps_avx512vl(_local_3c0,auVar97);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_360);
      auVar86 = vfmadd231ps_avx512vl(auVar86,auVar98,local_380);
      auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,local_320);
      auVar87 = vfmadd231ps_avx512vl(auVar86,auVar100,local_340);
      auVar88 = vfmadd231ps_avx512vl(auVar85,auVar99,local_2e0);
      auVar198 = ZEXT3264(auVar88);
      auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar28);
      auVar86 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x484);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x908);
      auVar89 = vfmadd231ps_avx512vl(auVar87,auVar99,local_300);
      auVar190 = ZEXT3264(auVar89);
      auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0xd8c);
      auVar90 = vmulps_avx512vl(_local_3a0,auVar87);
      auVar91 = vmulps_avx512vl(_local_3c0,auVar87);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar96,local_360);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_380);
      auVar90 = vfmadd231ps_avx512vl(auVar90,auVar86,local_320);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,local_340);
      auVar24 = vfmadd231ps_fma(auVar90,auVar85,local_2e0);
      auVar203 = ZEXT1664(auVar24);
      auVar25 = vfmadd231ps_fma(auVar91,auVar85,local_300);
      auVar90 = vsubps_avx512vl(ZEXT1632(auVar24),auVar88);
      auVar91 = vsubps_avx512vl(ZEXT1632(auVar25),auVar89);
      auVar92 = vmulps_avx512vl(auVar89,auVar90);
      auVar93 = vmulps_avx512vl(auVar88,auVar91);
      auVar92 = vsubps_avx512vl(auVar92,auVar93);
      auVar77 = vshufps_avx(local_5a0,local_5a0,0xff);
      uVar154 = auVar77._0_8_;
      local_80._8_8_ = uVar154;
      local_80._0_8_ = uVar154;
      local_80._16_8_ = uVar154;
      local_80._24_8_ = uVar154;
      auVar77 = vshufps_avx(local_5c0,local_5c0,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar77);
      auVar77 = vshufps_avx(local_5d0,local_5d0,0xff);
      local_c0 = vbroadcastsd_avx512vl(auVar77);
      auVar77 = vshufps_avx512vl(_local_5b0,_local_5b0,0xff);
      uVar154 = auVar77._0_8_;
      local_e0._8_8_ = uVar154;
      local_e0._0_8_ = uVar154;
      local_e0._16_8_ = uVar154;
      local_e0._24_8_ = uVar154;
      auVar93 = vmulps_avx512vl(local_e0,auVar97);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,local_c0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_a0);
      auVar93 = vfmadd231ps_avx512vl(auVar93,auVar99,local_80);
      auVar94 = vmulps_avx512vl(local_e0,auVar87);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar96,local_c0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar86,local_a0);
      auVar26 = vfmadd231ps_fma(auVar94,auVar85,local_80);
      auVar94 = vmulps_avx512vl(auVar91,auVar91);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar90);
      auVar95 = vmaxps_avx512vl(auVar93,ZEXT1632(auVar26));
      auVar95 = vmulps_avx512vl(auVar95,auVar95);
      auVar94 = vmulps_avx512vl(auVar95,auVar94);
      auVar92 = vmulps_avx512vl(auVar92,auVar92);
      uVar154 = vcmpps_avx512vl(auVar92,auVar94,2);
      auVar77 = vblendps_avx(auVar21,local_5a0,8);
      auVar220 = auVar221._0_16_;
      auVar78 = vandps_avx512vl(auVar77,auVar220);
      auVar77 = vblendps_avx(auVar22,local_5c0,8);
      auVar77 = vandps_avx512vl(auVar77,auVar220);
      auVar78 = vmaxps_avx(auVar78,auVar77);
      auVar77 = vblendps_avx(auVar20,local_5d0,8);
      auVar82 = vandps_avx512vl(auVar77,auVar220);
      auVar77 = vblendps_avx(auVar23,_local_5b0,8);
      auVar77 = vandps_avx512vl(auVar77,auVar220);
      auVar77 = vmaxps_avx(auVar82,auVar77);
      auVar77 = vmaxps_avx(auVar78,auVar77);
      auVar78 = vmovshdup_avx(auVar77);
      auVar78 = vmaxss_avx(auVar78,auVar77);
      auVar77 = vshufpd_avx(auVar77,auVar77,1);
      auVar77 = vmaxss_avx(auVar77,auVar78);
      local_550 = vcvtsi2ss_avx512f(auVar220,iVar8);
      auVar94._0_4_ = local_550._0_4_;
      auVar94._4_4_ = auVar94._0_4_;
      auVar94._8_4_ = auVar94._0_4_;
      auVar94._12_4_ = auVar94._0_4_;
      auVar94._16_4_ = auVar94._0_4_;
      auVar94._20_4_ = auVar94._0_4_;
      auVar94._24_4_ = auVar94._0_4_;
      auVar94._28_4_ = auVar94._0_4_;
      uVar27 = vcmpps_avx512vl(auVar94,_DAT_01faff40,0xe);
      bVar72 = (byte)uVar154 & (byte)uVar27;
      fVar161 = auVar77._0_4_ * 4.7683716e-07;
      local_500._0_16_ = ZEXT416((uint)fVar161);
      auVar92._8_4_ = 2;
      auVar92._0_8_ = 0x200000002;
      auVar92._12_4_ = 2;
      auVar92._16_4_ = 2;
      auVar92._20_4_ = 2;
      auVar92._24_4_ = 2;
      auVar92._28_4_ = 2;
      local_120 = vpermps_avx2(auVar92,ZEXT1632(auVar21));
      local_140 = vpermps_avx2(auVar92,ZEXT1632(auVar22));
      local_160 = vpermps_avx2(auVar92,ZEXT1632(auVar20));
      local_180 = vpermps_avx2(auVar92,ZEXT1632(auVar23));
      local_4a0 = *(undefined4 *)(ray + k * 4 + 0x30);
      uStack_49c = 0;
      uStack_498 = 0;
      uStack_494 = 0;
      if (bVar72 != 0) {
        auVar87 = vmulps_avx512vl(local_180,auVar87);
        auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar87);
        auVar86 = vfmadd213ps_avx512vl(auVar86,local_140,auVar96);
        auVar87 = vfmadd213ps_avx512vl(auVar85,local_120,auVar86);
        auVar97 = vmulps_avx512vl(local_180,auVar97);
        auVar98 = vfmadd213ps_avx512vl(auVar98,local_160,auVar97);
        auVar86 = vfmadd213ps_avx512vl(auVar100,local_140,auVar98);
        auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1694);
        auVar97 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1b18);
        auVar85 = *(undefined1 (*) [32])(bezier_basis0 + lVar28 + 0x1f9c);
        auVar92 = vfmadd213ps_avx512vl(auVar99,local_120,auVar86);
        auVar99 = vmulps_avx512vl(_local_3a0,auVar85);
        auVar86 = vmulps_avx512vl(_local_3c0,auVar85);
        auVar85 = vmulps_avx512vl(local_180,auVar85);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_360);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar97,local_380);
        auVar97 = vfmadd231ps_avx512vl(auVar85,local_160,auVar97);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar98,local_320);
        auVar85 = vfmadd231ps_avx512vl(auVar86,auVar98,local_340);
        auVar86 = vfmadd231ps_avx512vl(auVar97,local_140,auVar98);
        auVar77 = vfmadd231ps_fma(auVar99,auVar100,local_2e0);
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar100,local_300);
        auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1210);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1b18);
        auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1f9c);
        auVar86 = vfmadd231ps_avx512vl(auVar86,local_120,auVar100);
        auVar100 = vmulps_avx512vl(_local_3a0,auVar97);
        auVar96 = vmulps_avx512vl(_local_3c0,auVar97);
        auVar97 = vmulps_avx512vl(local_180,auVar97);
        auVar95 = vfmadd231ps_avx512vl(auVar100,auVar98,local_360);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,local_380);
        auVar98 = vfmadd231ps_avx512vl(auVar97,local_160,auVar98);
        auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar28 + 0x1694);
        auVar97 = vfmadd231ps_avx512vl(auVar95,auVar100,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_340);
        auVar100 = vfmadd231ps_avx512vl(auVar98,local_140,auVar100);
        auVar223 = ZEXT1664(auVar222);
        auVar78 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar221 = ZEXT1664(auVar78);
        auVar78 = vfmadd231ps_fma(auVar97,auVar99,local_2e0);
        auVar98 = vfmadd231ps_avx512vl(auVar96,auVar99,local_300);
        auVar97 = vfmadd231ps_avx512vl(auVar100,local_120,auVar99);
        auVar215._8_4_ = 0x7fffffff;
        auVar215._0_8_ = 0x7fffffff7fffffff;
        auVar215._12_4_ = 0x7fffffff;
        auVar215._16_4_ = 0x7fffffff;
        auVar215._20_4_ = 0x7fffffff;
        auVar215._24_4_ = 0x7fffffff;
        auVar215._28_4_ = 0x7fffffff;
        auVar99 = vandps_avx(ZEXT1632(auVar77),auVar215);
        auVar100 = vandps_avx(auVar85,auVar215);
        auVar100 = vmaxps_avx(auVar99,auVar100);
        auVar99 = vandps_avx(auVar86,auVar215);
        auVar99 = vmaxps_avx(auVar100,auVar99);
        auVar207._4_4_ = fVar161;
        auVar207._0_4_ = fVar161;
        auVar207._8_4_ = fVar161;
        auVar207._12_4_ = fVar161;
        auVar207._16_4_ = fVar161;
        auVar207._20_4_ = fVar161;
        auVar207._24_4_ = fVar161;
        auVar207._28_4_ = fVar161;
        uVar64 = vcmpps_avx512vl(auVar99,auVar207,1);
        bVar14 = (bool)((byte)uVar64 & 1);
        auVar95._0_4_ = (float)((uint)bVar14 * auVar90._0_4_ | (uint)!bVar14 * auVar77._0_4_);
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar95._4_4_ = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar77._4_4_);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar95._8_4_ = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar77._8_4_);
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar95._12_4_ = (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar77._12_4_);
        fVar152 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar90._16_4_);
        auVar95._16_4_ = fVar152;
        fVar151 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar90._20_4_);
        auVar95._20_4_ = fVar151;
        fVar161 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar90._24_4_);
        auVar95._24_4_ = fVar161;
        auVar95._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar90._28_4_;
        bVar14 = (bool)((byte)uVar64 & 1);
        auVar101._0_4_ = (float)((uint)bVar14 * auVar91._0_4_ | (uint)!bVar14 * auVar85._0_4_);
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar101._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar85._4_4_);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar101._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar85._8_4_);
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar101._12_4_ = (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar85._12_4_);
        bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar101._16_4_ = (float)((uint)bVar14 * auVar91._16_4_ | (uint)!bVar14 * auVar85._16_4_);
        bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar101._20_4_ = (float)((uint)bVar14 * auVar91._20_4_ | (uint)!bVar14 * auVar85._20_4_);
        bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar101._24_4_ = (float)((uint)bVar14 * auVar91._24_4_ | (uint)!bVar14 * auVar85._24_4_);
        bVar14 = SUB81(uVar64 >> 7,0);
        auVar101._28_4_ = (uint)bVar14 * auVar91._28_4_ | (uint)!bVar14 * auVar85._28_4_;
        auVar99 = vandps_avx(auVar215,ZEXT1632(auVar78));
        auVar100 = vandps_avx(auVar98,auVar215);
        auVar100 = vmaxps_avx(auVar99,auVar100);
        auVar99 = vandps_avx(auVar97,auVar215);
        auVar99 = vmaxps_avx(auVar100,auVar99);
        uVar64 = vcmpps_avx512vl(auVar99,auVar207,1);
        bVar14 = (bool)((byte)uVar64 & 1);
        auVar102._0_4_ = (float)((uint)bVar14 * auVar90._0_4_ | (uint)!bVar14 * auVar78._0_4_);
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar102._4_4_ = (float)((uint)bVar14 * auVar90._4_4_ | (uint)!bVar14 * auVar78._4_4_);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar102._8_4_ = (float)((uint)bVar14 * auVar90._8_4_ | (uint)!bVar14 * auVar78._8_4_);
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar102._12_4_ = (float)((uint)bVar14 * auVar90._12_4_ | (uint)!bVar14 * auVar78._12_4_);
        fVar173 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar90._16_4_);
        auVar102._16_4_ = fVar173;
        fVar160 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar90._20_4_);
        auVar102._20_4_ = fVar160;
        fVar153 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar90._24_4_);
        auVar102._24_4_ = fVar153;
        uVar65 = (uint)(byte)(uVar64 >> 7) * auVar90._28_4_;
        auVar102._28_4_ = uVar65;
        bVar14 = (bool)((byte)uVar64 & 1);
        auVar103._0_4_ = (float)((uint)bVar14 * auVar91._0_4_ | (uint)!bVar14 * auVar98._0_4_);
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar14 * auVar91._4_4_ | (uint)!bVar14 * auVar98._4_4_);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar14 * auVar91._8_4_ | (uint)!bVar14 * auVar98._8_4_);
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar14 * auVar91._12_4_ | (uint)!bVar14 * auVar98._12_4_);
        bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar14 * auVar91._16_4_ | (uint)!bVar14 * auVar98._16_4_);
        bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar14 * auVar91._20_4_ | (uint)!bVar14 * auVar98._20_4_);
        bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar14 * auVar91._24_4_ | (uint)!bVar14 * auVar98._24_4_);
        bVar14 = SUB81(uVar64 >> 7,0);
        auVar103._28_4_ = (uint)bVar14 * auVar91._28_4_ | (uint)!bVar14 * auVar98._28_4_;
        auVar83 = vxorps_avx512vl(auVar176,auVar176);
        auVar99 = vfmadd213ps_avx512vl(auVar95,auVar95,ZEXT1632(auVar83));
        auVar77 = vfmadd231ps_fma(auVar99,auVar101,auVar101);
        auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
        fVar75 = auVar100._0_4_;
        fVar76 = auVar100._4_4_;
        fVar125 = auVar100._8_4_;
        fVar126 = auVar100._12_4_;
        fVar127 = auVar100._16_4_;
        fVar128 = auVar100._20_4_;
        fVar130 = auVar100._24_4_;
        auVar99._4_4_ = fVar76 * fVar76 * fVar76 * auVar77._4_4_ * -0.5;
        auVar99._0_4_ = fVar75 * fVar75 * fVar75 * auVar77._0_4_ * -0.5;
        auVar99._8_4_ = fVar125 * fVar125 * fVar125 * auVar77._8_4_ * -0.5;
        auVar99._12_4_ = fVar126 * fVar126 * fVar126 * auVar77._12_4_ * -0.5;
        auVar99._16_4_ = fVar127 * fVar127 * fVar127 * -0.0;
        auVar99._20_4_ = fVar128 * fVar128 * fVar128 * -0.0;
        auVar99._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
        auVar99._28_4_ = auVar97._28_4_;
        auVar85 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar85,auVar100);
        auVar100._4_4_ = auVar101._4_4_ * auVar99._4_4_;
        auVar100._0_4_ = auVar101._0_4_ * auVar99._0_4_;
        auVar100._8_4_ = auVar101._8_4_ * auVar99._8_4_;
        auVar100._12_4_ = auVar101._12_4_ * auVar99._12_4_;
        auVar100._16_4_ = auVar101._16_4_ * auVar99._16_4_;
        auVar100._20_4_ = auVar101._20_4_ * auVar99._20_4_;
        auVar100._24_4_ = auVar101._24_4_ * auVar99._24_4_;
        auVar100._28_4_ = 0;
        auVar98._4_4_ = auVar99._4_4_ * -auVar95._4_4_;
        auVar98._0_4_ = auVar99._0_4_ * -auVar95._0_4_;
        auVar98._8_4_ = auVar99._8_4_ * -auVar95._8_4_;
        auVar98._12_4_ = auVar99._12_4_ * -auVar95._12_4_;
        auVar98._16_4_ = auVar99._16_4_ * -fVar152;
        auVar98._20_4_ = auVar99._20_4_ * -fVar151;
        auVar98._24_4_ = auVar99._24_4_ * -fVar161;
        auVar98._28_4_ = auVar101._28_4_;
        auVar99 = vmulps_avx512vl(auVar99,ZEXT1632(auVar83));
        auVar91 = ZEXT1632(auVar83);
        auVar97 = vfmadd213ps_avx512vl(auVar102,auVar102,auVar91);
        auVar77 = vfmadd231ps_fma(auVar97,auVar103,auVar103);
        auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar77));
        fVar161 = auVar96._0_4_;
        fVar151 = auVar96._4_4_;
        fVar152 = auVar96._8_4_;
        fVar75 = auVar96._12_4_;
        fVar76 = auVar96._16_4_;
        fVar125 = auVar96._20_4_;
        fVar126 = auVar96._24_4_;
        auVar97._4_4_ = fVar151 * fVar151 * fVar151 * auVar77._4_4_ * -0.5;
        auVar97._0_4_ = fVar161 * fVar161 * fVar161 * auVar77._0_4_ * -0.5;
        auVar97._8_4_ = fVar152 * fVar152 * fVar152 * auVar77._8_4_ * -0.5;
        auVar97._12_4_ = fVar75 * fVar75 * fVar75 * auVar77._12_4_ * -0.5;
        auVar97._16_4_ = fVar76 * fVar76 * fVar76 * -0.0;
        auVar97._20_4_ = fVar125 * fVar125 * fVar125 * -0.0;
        auVar97._24_4_ = fVar126 * fVar126 * fVar126 * -0.0;
        auVar97._28_4_ = 0;
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar85,auVar96);
        auVar86._4_4_ = auVar103._4_4_ * auVar97._4_4_;
        auVar86._0_4_ = auVar103._0_4_ * auVar97._0_4_;
        auVar86._8_4_ = auVar103._8_4_ * auVar97._8_4_;
        auVar86._12_4_ = auVar103._12_4_ * auVar97._12_4_;
        auVar86._16_4_ = auVar103._16_4_ * auVar97._16_4_;
        auVar86._20_4_ = auVar103._20_4_ * auVar97._20_4_;
        auVar86._24_4_ = auVar103._24_4_ * auVar97._24_4_;
        auVar86._28_4_ = auVar96._28_4_;
        auVar96._4_4_ = -auVar102._4_4_ * auVar97._4_4_;
        auVar96._0_4_ = -auVar102._0_4_ * auVar97._0_4_;
        auVar96._8_4_ = -auVar102._8_4_ * auVar97._8_4_;
        auVar96._12_4_ = -auVar102._12_4_ * auVar97._12_4_;
        auVar96._16_4_ = -fVar173 * auVar97._16_4_;
        auVar96._20_4_ = -fVar160 * auVar97._20_4_;
        auVar96._24_4_ = -fVar153 * auVar97._24_4_;
        auVar96._28_4_ = uVar65 ^ 0x80000000;
        auVar97 = vmulps_avx512vl(auVar97,auVar91);
        auVar77 = vfmadd213ps_fma(auVar100,auVar93,auVar88);
        auVar78 = vfmadd213ps_fma(auVar98,auVar93,auVar89);
        auVar85 = vfmadd213ps_avx512vl(auVar99,auVar93,auVar92);
        auVar90 = vfmadd213ps_avx512vl(auVar86,ZEXT1632(auVar26),ZEXT1632(auVar24));
        auVar82 = vfnmadd213ps_fma(auVar100,auVar93,auVar88);
        auVar88 = ZEXT1632(auVar26);
        auVar20 = vfmadd213ps_fma(auVar96,auVar88,ZEXT1632(auVar25));
        auVar220 = vfnmadd213ps_fma(auVar98,auVar93,auVar89);
        auVar21 = vfmadd213ps_fma(auVar97,auVar88,auVar87);
        auVar100 = vfnmadd231ps_avx512vl(auVar92,auVar93,auVar99);
        auVar24 = vfnmadd213ps_fma(auVar86,auVar88,ZEXT1632(auVar24));
        auVar25 = vfnmadd213ps_fma(auVar96,auVar88,ZEXT1632(auVar25));
        auVar222 = vfnmadd231ps_fma(auVar87,ZEXT1632(auVar26),auVar97);
        auVar98 = vsubps_avx512vl(auVar90,ZEXT1632(auVar82));
        auVar99 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar220));
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar21),auVar100);
        auVar86 = vmulps_avx512vl(auVar99,auVar100);
        auVar22 = vfmsub231ps_fma(auVar86,ZEXT1632(auVar220),auVar97);
        auVar87._4_4_ = auVar82._4_4_ * auVar97._4_4_;
        auVar87._0_4_ = auVar82._0_4_ * auVar97._0_4_;
        auVar87._8_4_ = auVar82._8_4_ * auVar97._8_4_;
        auVar87._12_4_ = auVar82._12_4_ * auVar97._12_4_;
        auVar87._16_4_ = auVar97._16_4_ * 0.0;
        auVar87._20_4_ = auVar97._20_4_ * 0.0;
        auVar87._24_4_ = auVar97._24_4_ * 0.0;
        auVar87._28_4_ = auVar97._28_4_;
        auVar97 = vfmsub231ps_avx512vl(auVar87,auVar100,auVar98);
        auVar88._4_4_ = auVar220._4_4_ * auVar98._4_4_;
        auVar88._0_4_ = auVar220._0_4_ * auVar98._0_4_;
        auVar88._8_4_ = auVar220._8_4_ * auVar98._8_4_;
        auVar88._12_4_ = auVar220._12_4_ * auVar98._12_4_;
        auVar88._16_4_ = auVar98._16_4_ * 0.0;
        auVar88._20_4_ = auVar98._20_4_ * 0.0;
        auVar88._24_4_ = auVar98._24_4_ * 0.0;
        auVar88._28_4_ = auVar98._28_4_;
        auVar23 = vfmsub231ps_fma(auVar88,ZEXT1632(auVar82),auVar99);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar23),auVar91,auVar97);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar91,ZEXT1632(auVar22));
        auVar92 = ZEXT1632(auVar83);
        uVar64 = vcmpps_avx512vl(auVar99,auVar92,2);
        bVar63 = (byte)uVar64;
        fVar75 = (float)((uint)(bVar63 & 1) * auVar77._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar24._0_4_);
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar125 = (float)((uint)bVar14 * auVar77._4_4_ | (uint)!bVar14 * auVar24._4_4_);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar127 = (float)((uint)bVar14 * auVar77._8_4_ | (uint)!bVar14 * auVar24._8_4_);
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar130 = (float)((uint)bVar14 * auVar77._12_4_ | (uint)!bVar14 * auVar24._12_4_);
        auVar96 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar127,CONCAT44(fVar125,fVar75))));
        fVar76 = (float)((uint)(bVar63 & 1) * auVar78._0_4_ |
                        (uint)!(bool)(bVar63 & 1) * auVar25._0_4_);
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        fVar126 = (float)((uint)bVar14 * auVar78._4_4_ | (uint)!bVar14 * auVar25._4_4_);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        fVar128 = (float)((uint)bVar14 * auVar78._8_4_ | (uint)!bVar14 * auVar25._8_4_);
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        fVar131 = (float)((uint)bVar14 * auVar78._12_4_ | (uint)!bVar14 * auVar25._12_4_);
        auVar87 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar128,CONCAT44(fVar126,fVar76))));
        auVar104._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar222._0_4_
                    );
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar14 * auVar85._4_4_ | (uint)!bVar14 * auVar222._4_4_);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar14 * auVar85._8_4_ | (uint)!bVar14 * auVar222._8_4_);
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar14 * auVar85._12_4_ | (uint)!bVar14 * auVar222._12_4_);
        fVar161 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar85._16_4_);
        auVar104._16_4_ = fVar161;
        fVar151 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar85._20_4_);
        auVar104._20_4_ = fVar151;
        fVar152 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar85._24_4_);
        auVar104._24_4_ = fVar152;
        iVar1 = (uint)(byte)(uVar64 >> 7) * auVar85._28_4_;
        auVar104._28_4_ = iVar1;
        auVar98 = vblendmps_avx512vl(ZEXT1632(auVar82),auVar90);
        auVar105._0_4_ =
             (uint)(bVar63 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar22._0_4_;
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar105._4_4_ = (uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar22._4_4_;
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar105._8_4_ = (uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar22._8_4_;
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar105._12_4_ = (uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar22._12_4_;
        auVar105._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar98._16_4_;
        auVar105._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar98._20_4_;
        auVar105._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar98._24_4_;
        auVar105._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar98._28_4_;
        auVar98 = vblendmps_avx512vl(ZEXT1632(auVar220),ZEXT1632(auVar20));
        auVar106._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar78._0_4_)
        ;
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar78._4_4_);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar78._8_4_);
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar78._12_4_);
        fVar153 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar98._16_4_);
        auVar106._16_4_ = fVar153;
        fVar160 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar98._20_4_);
        auVar106._20_4_ = fVar160;
        fVar173 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar98._24_4_);
        auVar106._24_4_ = fVar173;
        auVar106._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar98._28_4_;
        auVar98 = vblendmps_avx512vl(auVar100,ZEXT1632(auVar21));
        auVar107._0_4_ =
             (float)((uint)(bVar63 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar85._0_4_)
        ;
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar85._4_4_);
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar85._8_4_);
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar85._12_4_);
        bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar14 * auVar98._16_4_ | (uint)!bVar14 * auVar85._16_4_);
        bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar14 * auVar98._20_4_ | (uint)!bVar14 * auVar85._20_4_);
        bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar14 * auVar98._24_4_ | (uint)!bVar14 * auVar85._24_4_);
        bVar14 = SUB81(uVar64 >> 7,0);
        auVar107._28_4_ = (uint)bVar14 * auVar98._28_4_ | (uint)!bVar14 * auVar85._28_4_;
        auVar108._0_4_ =
             (uint)(bVar63 & 1) * (int)auVar82._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar90._0_4_;
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar108._4_4_ = (uint)bVar14 * (int)auVar82._4_4_ | (uint)!bVar14 * auVar90._4_4_;
        bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar108._8_4_ = (uint)bVar14 * (int)auVar82._8_4_ | (uint)!bVar14 * auVar90._8_4_;
        bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar108._12_4_ = (uint)bVar14 * (int)auVar82._12_4_ | (uint)!bVar14 * auVar90._12_4_;
        auVar108._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar90._16_4_;
        auVar108._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar90._20_4_;
        auVar108._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar90._24_4_;
        auVar108._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar90._28_4_;
        bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar109._0_4_ =
             (uint)(bVar63 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar21._0_4_;
        bVar15 = (bool)((byte)(uVar64 >> 1) & 1);
        auVar109._4_4_ = (uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar21._4_4_;
        bVar15 = (bool)((byte)(uVar64 >> 2) & 1);
        auVar109._8_4_ = (uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar21._8_4_;
        bVar15 = (bool)((byte)(uVar64 >> 3) & 1);
        auVar109._12_4_ = (uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar21._12_4_;
        auVar109._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar100._16_4_;
        auVar109._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar100._20_4_;
        auVar109._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar100._24_4_;
        iVar2 = (uint)(byte)(uVar64 >> 7) * auVar100._28_4_;
        auVar109._28_4_ = iVar2;
        auVar88 = vsubps_avx512vl(auVar108,auVar96);
        auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar220._12_4_ |
                                                 (uint)!bVar17 * auVar20._12_4_,
                                                 CONCAT48((uint)bVar16 * (int)auVar220._8_4_ |
                                                          (uint)!bVar16 * auVar20._8_4_,
                                                          CONCAT44((uint)bVar14 *
                                                                   (int)auVar220._4_4_ |
                                                                   (uint)!bVar14 * auVar20._4_4_,
                                                                   (uint)(bVar63 & 1) *
                                                                   (int)auVar220._0_4_ |
                                                                   (uint)!(bool)(bVar63 & 1) *
                                                                   auVar20._0_4_)))),auVar87);
        auVar198 = ZEXT3264(auVar100);
        auVar98 = vsubps_avx(auVar109,auVar104);
        auVar97 = vsubps_avx(auVar96,auVar105);
        auVar203 = ZEXT3264(auVar97);
        auVar85 = vsubps_avx(auVar87,auVar106);
        auVar86 = vsubps_avx(auVar104,auVar107);
        auVar89._4_4_ = auVar98._4_4_ * fVar125;
        auVar89._0_4_ = auVar98._0_4_ * fVar75;
        auVar89._8_4_ = auVar98._8_4_ * fVar127;
        auVar89._12_4_ = auVar98._12_4_ * fVar130;
        auVar89._16_4_ = auVar98._16_4_ * 0.0;
        auVar89._20_4_ = auVar98._20_4_ * 0.0;
        auVar89._24_4_ = auVar98._24_4_ * 0.0;
        auVar89._28_4_ = iVar2;
        auVar77 = vfmsub231ps_fma(auVar89,auVar104,auVar88);
        auVar90._4_4_ = fVar126 * auVar88._4_4_;
        auVar90._0_4_ = fVar76 * auVar88._0_4_;
        auVar90._8_4_ = fVar128 * auVar88._8_4_;
        auVar90._12_4_ = fVar131 * auVar88._12_4_;
        auVar90._16_4_ = auVar88._16_4_ * 0.0;
        auVar90._20_4_ = auVar88._20_4_ * 0.0;
        auVar90._24_4_ = auVar88._24_4_ * 0.0;
        auVar90._28_4_ = auVar99._28_4_;
        auVar78 = vfmsub231ps_fma(auVar90,auVar96,auVar100);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar92,ZEXT1632(auVar77));
        auVar186._0_4_ = auVar100._0_4_ * auVar104._0_4_;
        auVar186._4_4_ = auVar100._4_4_ * auVar104._4_4_;
        auVar186._8_4_ = auVar100._8_4_ * auVar104._8_4_;
        auVar186._12_4_ = auVar100._12_4_ * auVar104._12_4_;
        auVar186._16_4_ = auVar100._16_4_ * fVar161;
        auVar186._20_4_ = auVar100._20_4_ * fVar151;
        auVar186._24_4_ = auVar100._24_4_ * fVar152;
        auVar186._28_4_ = 0;
        auVar77 = vfmsub231ps_fma(auVar186,auVar87,auVar98);
        auVar89 = vfmadd231ps_avx512vl(auVar99,auVar92,ZEXT1632(auVar77));
        auVar99 = vmulps_avx512vl(auVar86,auVar105);
        auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar107);
        auVar91._4_4_ = auVar85._4_4_ * auVar107._4_4_;
        auVar91._0_4_ = auVar85._0_4_ * auVar107._0_4_;
        auVar91._8_4_ = auVar85._8_4_ * auVar107._8_4_;
        auVar91._12_4_ = auVar85._12_4_ * auVar107._12_4_;
        auVar91._16_4_ = auVar85._16_4_ * auVar107._16_4_;
        auVar91._20_4_ = auVar85._20_4_ * auVar107._20_4_;
        auVar91._24_4_ = auVar85._24_4_ * auVar107._24_4_;
        auVar91._28_4_ = auVar107._28_4_;
        auVar77 = vfmsub231ps_fma(auVar91,auVar106,auVar86);
        auVar187._0_4_ = auVar106._0_4_ * auVar97._0_4_;
        auVar187._4_4_ = auVar106._4_4_ * auVar97._4_4_;
        auVar187._8_4_ = auVar106._8_4_ * auVar97._8_4_;
        auVar187._12_4_ = auVar106._12_4_ * auVar97._12_4_;
        auVar187._16_4_ = fVar153 * auVar97._16_4_;
        auVar187._20_4_ = fVar160 * auVar97._20_4_;
        auVar187._24_4_ = fVar173 * auVar97._24_4_;
        auVar187._28_4_ = 0;
        auVar78 = vfmsub231ps_fma(auVar187,auVar85,auVar105);
        auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar92,auVar99);
        auVar90 = vfmadd231ps_avx512vl(auVar99,auVar92,ZEXT1632(auVar77));
        auVar190 = ZEXT3264(auVar90);
        auVar99 = vmaxps_avx(auVar89,auVar90);
        uVar154 = vcmpps_avx512vl(auVar99,auVar92,2);
        bVar72 = bVar72 & (byte)uVar154;
        if (bVar72 != 0) {
          uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar216._4_4_ = uVar134;
          auVar216._0_4_ = uVar134;
          auVar216._8_4_ = uVar134;
          auVar216._12_4_ = uVar134;
          auVar216._16_4_ = uVar134;
          auVar216._20_4_ = uVar134;
          auVar216._24_4_ = uVar134;
          auVar216._28_4_ = uVar134;
          auVar219 = ZEXT3264(auVar216);
          auVar37._4_4_ = auVar86._4_4_ * auVar100._4_4_;
          auVar37._0_4_ = auVar86._0_4_ * auVar100._0_4_;
          auVar37._8_4_ = auVar86._8_4_ * auVar100._8_4_;
          auVar37._12_4_ = auVar86._12_4_ * auVar100._12_4_;
          auVar37._16_4_ = auVar86._16_4_ * auVar100._16_4_;
          auVar37._20_4_ = auVar86._20_4_ * auVar100._20_4_;
          auVar37._24_4_ = auVar86._24_4_ * auVar100._24_4_;
          auVar37._28_4_ = auVar99._28_4_;
          auVar21 = vfmsub231ps_fma(auVar37,auVar85,auVar98);
          auVar38._4_4_ = auVar98._4_4_ * auVar97._4_4_;
          auVar38._0_4_ = auVar98._0_4_ * auVar97._0_4_;
          auVar38._8_4_ = auVar98._8_4_ * auVar97._8_4_;
          auVar38._12_4_ = auVar98._12_4_ * auVar97._12_4_;
          auVar38._16_4_ = auVar98._16_4_ * auVar97._16_4_;
          auVar38._20_4_ = auVar98._20_4_ * auVar97._20_4_;
          auVar38._24_4_ = auVar98._24_4_ * auVar97._24_4_;
          auVar38._28_4_ = auVar98._28_4_;
          auVar20 = vfmsub231ps_fma(auVar38,auVar88,auVar86);
          auVar39._4_4_ = auVar85._4_4_ * auVar88._4_4_;
          auVar39._0_4_ = auVar85._0_4_ * auVar88._0_4_;
          auVar39._8_4_ = auVar85._8_4_ * auVar88._8_4_;
          auVar39._12_4_ = auVar85._12_4_ * auVar88._12_4_;
          auVar39._16_4_ = auVar85._16_4_ * auVar88._16_4_;
          auVar39._20_4_ = auVar85._20_4_ * auVar88._20_4_;
          auVar39._24_4_ = auVar85._24_4_ * auVar88._24_4_;
          auVar39._28_4_ = auVar85._28_4_;
          auVar22 = vfmsub231ps_fma(auVar39,auVar97,auVar100);
          auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar20),ZEXT1632(auVar22));
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar77),ZEXT1632(auVar21),ZEXT1232(ZEXT412(0)) << 0x20
                                   );
          auVar99 = vrcp14ps_avx512vl(ZEXT1632(auVar78));
          auVar32._8_4_ = 0x3f800000;
          auVar32._0_8_ = 0x3f8000003f800000;
          auVar32._12_4_ = 0x3f800000;
          auVar32._16_4_ = 0x3f800000;
          auVar32._20_4_ = 0x3f800000;
          auVar32._24_4_ = 0x3f800000;
          auVar32._28_4_ = 0x3f800000;
          auVar100 = vfnmadd213ps_avx512vl(auVar99,ZEXT1632(auVar78),auVar32);
          auVar77 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
          auVar198 = ZEXT1664(auVar77);
          auVar40._4_4_ = auVar22._4_4_ * auVar104._4_4_;
          auVar40._0_4_ = auVar22._0_4_ * auVar104._0_4_;
          auVar40._8_4_ = auVar22._8_4_ * auVar104._8_4_;
          auVar40._12_4_ = auVar22._12_4_ * auVar104._12_4_;
          auVar40._16_4_ = fVar161 * 0.0;
          auVar40._20_4_ = fVar151 * 0.0;
          auVar40._24_4_ = fVar152 * 0.0;
          auVar40._28_4_ = iVar1;
          auVar20 = vfmadd231ps_fma(auVar40,auVar87,ZEXT1632(auVar20));
          auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar96,ZEXT1632(auVar21));
          fVar161 = auVar77._0_4_;
          fVar151 = auVar77._4_4_;
          fVar152 = auVar77._8_4_;
          fVar153 = auVar77._12_4_;
          local_520._28_4_ = auVar99._28_4_;
          local_520._0_28_ =
               ZEXT1628(CONCAT412(auVar20._12_4_ * fVar153,
                                  CONCAT48(auVar20._8_4_ * fVar152,
                                           CONCAT44(auVar20._4_4_ * fVar151,auVar20._0_4_ * fVar161)
                                          )));
          auVar203 = ZEXT3264(local_520);
          auVar143._4_4_ = local_4a0;
          auVar143._0_4_ = local_4a0;
          auVar143._8_4_ = local_4a0;
          auVar143._12_4_ = local_4a0;
          auVar143._16_4_ = local_4a0;
          auVar143._20_4_ = local_4a0;
          auVar143._24_4_ = local_4a0;
          auVar143._28_4_ = local_4a0;
          uVar154 = vcmpps_avx512vl(local_520,auVar216,2);
          uVar27 = vcmpps_avx512vl(auVar143,local_520,2);
          bVar72 = (byte)uVar154 & (byte)uVar27 & bVar72;
          if (bVar72 != 0) {
            uVar73 = vcmpps_avx512vl(ZEXT1632(auVar78),ZEXT1232(ZEXT412(0)) << 0x20,4);
            uVar73 = bVar72 & uVar73;
            if ((char)uVar73 != '\0') {
              fVar160 = auVar89._0_4_ * fVar161;
              fVar173 = auVar89._4_4_ * fVar151;
              auVar41._4_4_ = fVar173;
              auVar41._0_4_ = fVar160;
              fVar75 = auVar89._8_4_ * fVar152;
              auVar41._8_4_ = fVar75;
              fVar76 = auVar89._12_4_ * fVar153;
              auVar41._12_4_ = fVar76;
              fVar125 = auVar89._16_4_ * 0.0;
              auVar41._16_4_ = fVar125;
              fVar126 = auVar89._20_4_ * 0.0;
              auVar41._20_4_ = fVar126;
              fVar127 = auVar89._24_4_ * 0.0;
              auVar41._24_4_ = fVar127;
              auVar41._28_4_ = auVar89._28_4_;
              auVar144._8_4_ = 0x3f800000;
              auVar144._0_8_ = 0x3f8000003f800000;
              auVar144._12_4_ = 0x3f800000;
              auVar144._16_4_ = 0x3f800000;
              auVar144._20_4_ = 0x3f800000;
              auVar144._24_4_ = 0x3f800000;
              auVar144._28_4_ = 0x3f800000;
              auVar99 = vsubps_avx(auVar144,auVar41);
              local_2c0._0_4_ =
                   (float)((uint)(bVar63 & 1) * (int)fVar160 |
                          (uint)!(bool)(bVar63 & 1) * auVar99._0_4_);
              bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
              local_2c0._4_4_ = (float)((uint)bVar14 * (int)fVar173 | (uint)!bVar14 * auVar99._4_4_)
              ;
              bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
              local_2c0._8_4_ = (float)((uint)bVar14 * (int)fVar75 | (uint)!bVar14 * auVar99._8_4_);
              bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
              local_2c0._12_4_ =
                   (float)((uint)bVar14 * (int)fVar76 | (uint)!bVar14 * auVar99._12_4_);
              bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
              local_2c0._16_4_ =
                   (float)((uint)bVar14 * (int)fVar125 | (uint)!bVar14 * auVar99._16_4_);
              bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
              local_2c0._20_4_ =
                   (float)((uint)bVar14 * (int)fVar126 | (uint)!bVar14 * auVar99._20_4_);
              bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
              local_2c0._24_4_ =
                   (float)((uint)bVar14 * (int)fVar127 | (uint)!bVar14 * auVar99._24_4_);
              bVar14 = SUB81(uVar64 >> 7,0);
              local_2c0._28_4_ =
                   (float)((uint)bVar14 * auVar89._28_4_ | (uint)!bVar14 * auVar99._28_4_);
              auVar99 = vsubps_avx(ZEXT1632(auVar26),auVar93);
              auVar77 = vfmadd213ps_fma(auVar99,local_2c0,auVar93);
              uVar134 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
              auVar93._4_4_ = uVar134;
              auVar93._0_4_ = uVar134;
              auVar93._8_4_ = uVar134;
              auVar93._12_4_ = uVar134;
              auVar93._16_4_ = uVar134;
              auVar93._20_4_ = uVar134;
              auVar93._24_4_ = uVar134;
              auVar93._28_4_ = uVar134;
              auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                           CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                    CONCAT44(auVar77._4_4_ +
                                                                             auVar77._4_4_,
                                                                             auVar77._0_4_ +
                                                                             auVar77._0_4_)))),
                                        auVar93);
              uVar74 = vcmpps_avx512vl(local_520,auVar99,6);
              uVar73 = uVar73 & uVar74;
              bVar72 = (byte)uVar73;
              if (bVar72 != 0) {
                auVar171._0_4_ = auVar90._0_4_ * fVar161;
                auVar171._4_4_ = auVar90._4_4_ * fVar151;
                auVar171._8_4_ = auVar90._8_4_ * fVar152;
                auVar171._12_4_ = auVar90._12_4_ * fVar153;
                auVar171._16_4_ = auVar90._16_4_ * 0.0;
                auVar171._20_4_ = auVar90._20_4_ * 0.0;
                auVar171._24_4_ = auVar90._24_4_ * 0.0;
                auVar171._28_4_ = 0;
                auVar181._8_4_ = 0x3f800000;
                auVar181._0_8_ = 0x3f8000003f800000;
                auVar181._12_4_ = 0x3f800000;
                auVar181._16_4_ = 0x3f800000;
                auVar181._20_4_ = 0x3f800000;
                auVar181._24_4_ = 0x3f800000;
                auVar181._28_4_ = 0x3f800000;
                auVar99 = vsubps_avx(auVar181,auVar171);
                auVar110._0_4_ =
                     (uint)(bVar63 & 1) * (int)auVar171._0_4_ |
                     (uint)!(bool)(bVar63 & 1) * auVar99._0_4_;
                bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
                auVar110._4_4_ = (uint)bVar14 * (int)auVar171._4_4_ | (uint)!bVar14 * auVar99._4_4_;
                bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                auVar110._8_4_ = (uint)bVar14 * (int)auVar171._8_4_ | (uint)!bVar14 * auVar99._8_4_;
                bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
                auVar110._12_4_ =
                     (uint)bVar14 * (int)auVar171._12_4_ | (uint)!bVar14 * auVar99._12_4_;
                bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
                auVar110._16_4_ =
                     (uint)bVar14 * (int)auVar171._16_4_ | (uint)!bVar14 * auVar99._16_4_;
                bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
                auVar110._20_4_ =
                     (uint)bVar14 * (int)auVar171._20_4_ | (uint)!bVar14 * auVar99._20_4_;
                bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
                auVar110._24_4_ =
                     (uint)bVar14 * (int)auVar171._24_4_ | (uint)!bVar14 * auVar99._24_4_;
                auVar110._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar99._28_4_;
                auVar33._8_4_ = 0x40000000;
                auVar33._0_8_ = 0x4000000040000000;
                auVar33._12_4_ = 0x40000000;
                auVar33._16_4_ = 0x40000000;
                auVar33._20_4_ = 0x40000000;
                auVar33._24_4_ = 0x40000000;
                auVar33._28_4_ = 0x40000000;
                local_2a0 = vfmsub132ps_avx512vl(auVar110,auVar181,auVar33);
                local_280 = local_520;
                local_260 = 0;
                local_25c = iVar8;
                local_250 = local_5a0._0_8_;
                uStack_248 = local_5a0._8_8_;
                local_240 = local_5c0._0_8_;
                uStack_238 = local_5c0._8_8_;
                local_230 = local_5d0._0_8_;
                uStack_228 = local_5d0._8_8_;
                local_220 = local_5b0;
                uStack_218 = uStack_5a8;
                if ((pGVar69->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar161 = 1.0 / auVar94._0_4_;
                  local_200[0] = fVar161 * (local_2c0._0_4_ + 0.0);
                  local_200[1] = fVar161 * (local_2c0._4_4_ + 1.0);
                  local_200[2] = fVar161 * (local_2c0._8_4_ + 2.0);
                  local_200[3] = fVar161 * (local_2c0._12_4_ + 3.0);
                  fStack_1f0 = fVar161 * (local_2c0._16_4_ + 4.0);
                  fStack_1ec = fVar161 * (local_2c0._20_4_ + 5.0);
                  fStack_1e8 = fVar161 * (local_2c0._24_4_ + 6.0);
                  fStack_1e4 = local_2c0._28_4_ + 7.0;
                  local_1e0 = local_2a0;
                  local_1c0 = local_520;
                  auVar145._8_4_ = 0x7f800000;
                  auVar145._0_8_ = 0x7f8000007f800000;
                  auVar145._12_4_ = 0x7f800000;
                  auVar145._16_4_ = 0x7f800000;
                  auVar145._20_4_ = 0x7f800000;
                  auVar145._24_4_ = 0x7f800000;
                  auVar145._28_4_ = 0x7f800000;
                  auVar99 = vblendmps_avx512vl(auVar145,local_520);
                  auVar111._0_4_ =
                       (uint)(bVar72 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar73 >> 1) & 1);
                  auVar111._4_4_ = (uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
                  auVar111._8_4_ = (uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
                  auVar111._12_4_ = (uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar73 >> 4) & 1);
                  auVar111._16_4_ = (uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                  auVar111._20_4_ = (uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = (bool)((byte)(uVar73 >> 6) & 1);
                  auVar111._24_4_ = (uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * 0x7f800000;
                  bVar14 = SUB81(uVar73 >> 7,0);
                  auVar111._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * 0x7f800000;
                  auVar99 = vshufps_avx(auVar111,auVar111,0xb1);
                  auVar99 = vminps_avx(auVar111,auVar99);
                  auVar100 = vshufpd_avx(auVar99,auVar99,5);
                  auVar99 = vminps_avx(auVar99,auVar100);
                  auVar100 = vpermpd_avx2(auVar99,0x4e);
                  auVar99 = vminps_avx(auVar99,auVar100);
                  uVar154 = vcmpps_avx512vl(auVar111,auVar99,0);
                  uVar65 = (uint)uVar73;
                  if (((byte)uVar154 & bVar72) != 0) {
                    uVar65 = (uint)((byte)uVar154 & bVar72);
                  }
                  uVar66 = 0;
                  for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                    uVar66 = uVar66 + 1;
                  }
                  uVar64 = (ulong)uVar66;
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (pGVar69->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar77 = vpbroadcastd_avx512vl();
                    local_3e0 = auVar77._0_4_;
                    uStack_3dc = auVar77._4_4_;
                    uStack_3d8 = auVar77._8_4_;
                    uStack_3d4 = auVar77._12_4_;
                    local_540 = vpbroadcastd_avx512vl();
                    do {
                      local_440 = local_200[uVar64];
                      local_430 = *(undefined4 *)(local_1e0 + uVar64 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar64 * 4);
                      local_588.context = context->user;
                      fVar151 = 1.0 - local_440;
                      fVar161 = fVar151 * fVar151 * -3.0;
                      auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),
                                                ZEXT416((uint)(local_440 * fVar151)),
                                                ZEXT416(0xc0000000));
                      auVar78 = vfmsub132ss_fma(ZEXT416((uint)(local_440 * fVar151)),
                                                ZEXT416((uint)(local_440 * local_440)),
                                                ZEXT416(0x40000000));
                      fVar151 = auVar77._0_4_ * 3.0;
                      fVar152 = auVar78._0_4_ * 3.0;
                      fVar153 = local_440 * local_440 * 3.0;
                      auVar197._0_4_ = fVar153 * (float)local_5b0._0_4_;
                      auVar197._4_4_ = fVar153 * (float)local_5b0._4_4_;
                      auVar197._8_4_ = fVar153 * (float)uStack_5a8;
                      auVar197._12_4_ = fVar153 * uStack_5a8._4_4_;
                      auVar198 = ZEXT1664(auVar197);
                      auVar141._4_4_ = fVar152;
                      auVar141._0_4_ = fVar152;
                      auVar141._8_4_ = fVar152;
                      auVar141._12_4_ = fVar152;
                      auVar77 = vfmadd132ps_fma(auVar141,auVar197,local_5d0);
                      auVar180._4_4_ = fVar151;
                      auVar180._0_4_ = fVar151;
                      auVar180._8_4_ = fVar151;
                      auVar180._12_4_ = fVar151;
                      auVar77 = vfmadd132ps_fma(auVar180,auVar77,local_5c0);
                      auVar142._4_4_ = fVar161;
                      auVar142._0_4_ = fVar161;
                      auVar142._8_4_ = fVar161;
                      auVar142._12_4_ = fVar161;
                      auVar77 = vfmadd132ps_fma(auVar142,auVar77,local_5a0);
                      local_470 = auVar77._0_4_;
                      local_460 = vshufps_avx(auVar77,auVar77,0x55);
                      auVar190 = ZEXT1664(local_460);
                      local_450 = vshufps_avx(auVar77,auVar77,0xaa);
                      iStack_46c = local_470;
                      iStack_468 = local_470;
                      iStack_464 = local_470;
                      fStack_43c = local_440;
                      fStack_438 = local_440;
                      fStack_434 = local_440;
                      uStack_42c = local_430;
                      uStack_428 = local_430;
                      uStack_424 = local_430;
                      local_420 = local_540._0_8_;
                      uStack_418 = local_540._8_8_;
                      local_410._4_4_ = uStack_3dc;
                      local_410._0_4_ = local_3e0;
                      local_410._8_4_ = uStack_3d8;
                      local_410._12_4_ = uStack_3d4;
                      vpcmpeqd_avx2(ZEXT1632(local_410),ZEXT1632(local_410));
                      uStack_3fc = (local_588.context)->instID[0];
                      local_400 = uStack_3fc;
                      uStack_3f8 = uStack_3fc;
                      uStack_3f4 = uStack_3fc;
                      uStack_3f0 = (local_588.context)->instPrimID[0];
                      uStack_3ec = uStack_3f0;
                      uStack_3e8 = uStack_3f0;
                      uStack_3e4 = uStack_3f0;
                      local_5f0 = local_4d0;
                      local_588.valid = (int *)local_5f0;
                      local_588.geometryUserPtr = pGVar69->userPtr;
                      local_588.hit = (RTCHitN *)&local_470;
                      local_588.N = 4;
                      local_4c0 = auVar219._0_32_;
                      local_588.ray = (RTCRayN *)ray;
                      if (pGVar69->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar190 = ZEXT1664(local_460);
                        auVar198 = ZEXT1664(auVar197);
                        (*pGVar69->intersectionFilterN)(&local_588);
                        auVar203 = ZEXT3264(local_520);
                        auVar219 = ZEXT3264(local_4c0);
                        auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                        auVar223 = ZEXT1664(auVar77);
                        auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar221 = ZEXT1664(auVar77);
                      }
                      uVar74 = vptestmd_avx512vl(local_5f0,local_5f0);
                      if ((uVar74 & 0xf) == 0) {
LAB_01bedbeb:
                        *(int *)(ray + k * 4 + 0x80) = auVar219._0_4_;
                      }
                      else {
                        p_Var13 = context->args->filter;
                        if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar69->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar190 = ZEXT1664(auVar190._0_16_);
                          auVar198 = ZEXT1664(auVar198._0_16_);
                          (*p_Var13)(&local_588);
                          auVar203 = ZEXT3264(local_520);
                          auVar219 = ZEXT3264(local_4c0);
                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
                          auVar223 = ZEXT1664(auVar77);
                          auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar221 = ZEXT1664(auVar77);
                        }
                        uVar74 = vptestmd_avx512vl(local_5f0,local_5f0);
                        uVar74 = uVar74 & 0xf;
                        bVar72 = (byte)uVar74;
                        if (bVar72 == 0) goto LAB_01bedbeb;
                        iVar1 = *(int *)(local_588.hit + 4);
                        iVar2 = *(int *)(local_588.hit + 8);
                        iVar59 = *(int *)(local_588.hit + 0xc);
                        bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar16 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_588.ray + 0xc0) =
                             (uint)(bVar72 & 1) * *(int *)local_588.hit |
                             (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0xc0);
                        *(uint *)(local_588.ray + 0xc4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_588.ray + 0xc4);
                        *(uint *)(local_588.ray + 200) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_588.ray + 200);
                        *(uint *)(local_588.ray + 0xcc) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_588.ray + 0xcc);
                        iVar1 = *(int *)(local_588.hit + 0x14);
                        iVar2 = *(int *)(local_588.hit + 0x18);
                        iVar59 = *(int *)(local_588.hit + 0x1c);
                        bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar16 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_588.ray + 0xd0) =
                             (uint)(bVar72 & 1) * *(int *)(local_588.hit + 0x10) |
                             (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0xd0);
                        *(uint *)(local_588.ray + 0xd4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_588.ray + 0xd4);
                        *(uint *)(local_588.ray + 0xd8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_588.ray + 0xd8);
                        *(uint *)(local_588.ray + 0xdc) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_588.ray + 0xdc);
                        iVar1 = *(int *)(local_588.hit + 0x24);
                        iVar2 = *(int *)(local_588.hit + 0x28);
                        iVar59 = *(int *)(local_588.hit + 0x2c);
                        bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar16 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_588.ray + 0xe0) =
                             (uint)(bVar72 & 1) * *(int *)(local_588.hit + 0x20) |
                             (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0xe0);
                        *(uint *)(local_588.ray + 0xe4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_588.ray + 0xe4);
                        *(uint *)(local_588.ray + 0xe8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_588.ray + 0xe8);
                        *(uint *)(local_588.ray + 0xec) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_588.ray + 0xec);
                        iVar1 = *(int *)(local_588.hit + 0x34);
                        iVar2 = *(int *)(local_588.hit + 0x38);
                        iVar59 = *(int *)(local_588.hit + 0x3c);
                        bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar16 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_588.ray + 0xf0) =
                             (uint)(bVar72 & 1) * *(int *)(local_588.hit + 0x30) |
                             (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0xf0);
                        *(uint *)(local_588.ray + 0xf4) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_588.ray + 0xf4);
                        *(uint *)(local_588.ray + 0xf8) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_588.ray + 0xf8);
                        *(uint *)(local_588.ray + 0xfc) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_588.ray + 0xfc);
                        iVar1 = *(int *)(local_588.hit + 0x44);
                        iVar2 = *(int *)(local_588.hit + 0x48);
                        iVar59 = *(int *)(local_588.hit + 0x4c);
                        bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                        bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                        bVar16 = SUB81(uVar74 >> 3,0);
                        *(uint *)(local_588.ray + 0x100) =
                             (uint)(bVar72 & 1) * *(int *)(local_588.hit + 0x40) |
                             (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0x100);
                        *(uint *)(local_588.ray + 0x104) =
                             (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_588.ray + 0x104);
                        *(uint *)(local_588.ray + 0x108) =
                             (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_588.ray + 0x108);
                        *(uint *)(local_588.ray + 0x10c) =
                             (uint)bVar16 * iVar59 | (uint)!bVar16 * *(int *)(local_588.ray + 0x10c)
                        ;
                        auVar77 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x50));
                        *(undefined1 (*) [16])(local_588.ray + 0x110) = auVar77;
                        auVar77 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x60));
                        *(undefined1 (*) [16])(local_588.ray + 0x120) = auVar77;
                        auVar77 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x70));
                        *(undefined1 (*) [16])(local_588.ray + 0x130) = auVar77;
                        auVar77 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x80));
                        *(undefined1 (*) [16])(local_588.ray + 0x140) = auVar77;
                        auVar219 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                      }
                      bVar72 = ~(byte)(1 << ((uint)uVar64 & 0x1f)) & (byte)uVar73;
                      uVar134 = auVar219._0_4_;
                      auVar149._4_4_ = uVar134;
                      auVar149._0_4_ = uVar134;
                      auVar149._8_4_ = uVar134;
                      auVar149._12_4_ = uVar134;
                      auVar149._16_4_ = uVar134;
                      auVar149._20_4_ = uVar134;
                      auVar149._24_4_ = uVar134;
                      auVar149._28_4_ = uVar134;
                      uVar154 = vcmpps_avx512vl(auVar203._0_32_,auVar149,2);
                      if ((bVar72 & (byte)uVar154) == 0) goto LAB_01becb7f;
                      bVar72 = bVar72 & (byte)uVar154;
                      uVar73 = (ulong)bVar72;
                      auVar150._8_4_ = 0x7f800000;
                      auVar150._0_8_ = 0x7f8000007f800000;
                      auVar150._12_4_ = 0x7f800000;
                      auVar150._16_4_ = 0x7f800000;
                      auVar150._20_4_ = 0x7f800000;
                      auVar150._24_4_ = 0x7f800000;
                      auVar150._28_4_ = 0x7f800000;
                      auVar99 = vblendmps_avx512vl(auVar150,auVar203._0_32_);
                      auVar124._0_4_ =
                           (uint)(bVar72 & 1) * auVar99._0_4_ |
                           (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                      bVar14 = (bool)(bVar72 >> 1 & 1);
                      auVar124._4_4_ = (uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar72 >> 2 & 1);
                      auVar124._8_4_ = (uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar72 >> 3 & 1);
                      auVar124._12_4_ = (uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar72 >> 4 & 1);
                      auVar124._16_4_ = (uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar72 >> 5 & 1);
                      auVar124._20_4_ = (uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * 0x7f800000;
                      bVar14 = (bool)(bVar72 >> 6 & 1);
                      auVar124._24_4_ = (uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * 0x7f800000;
                      auVar124._28_4_ =
                           (uint)(bVar72 >> 7) * auVar99._28_4_ |
                           (uint)!(bool)(bVar72 >> 7) * 0x7f800000;
                      auVar99 = vshufps_avx(auVar124,auVar124,0xb1);
                      auVar99 = vminps_avx(auVar124,auVar99);
                      auVar100 = vshufpd_avx(auVar99,auVar99,5);
                      auVar99 = vminps_avx(auVar99,auVar100);
                      auVar100 = vpermpd_avx2(auVar99,0x4e);
                      auVar99 = vminps_avx(auVar99,auVar100);
                      uVar154 = vcmpps_avx512vl(auVar124,auVar99,0);
                      bVar63 = (byte)uVar154 & bVar72;
                      if (bVar63 != 0) {
                        bVar72 = bVar63;
                      }
                      uVar65 = 0;
                      for (uVar66 = (uint)bVar72; (uVar66 & 1) == 0;
                          uVar66 = uVar66 >> 1 | 0x80000000) {
                        uVar65 = uVar65 + 1;
                      }
                      uVar64 = (ulong)uVar65;
                    } while( true );
                  }
                  fVar161 = local_200[uVar64];
                  uVar134 = *(undefined4 *)(local_1e0 + uVar64 * 4);
                  fVar152 = 1.0 - fVar161;
                  fVar151 = fVar152 * fVar152 * -3.0;
                  auVar190 = ZEXT464((uint)fVar151);
                  auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152)),
                                            ZEXT416((uint)(fVar161 * fVar152)),ZEXT416(0xc0000000));
                  auVar78 = vfmsub132ss_fma(ZEXT416((uint)(fVar161 * fVar152)),
                                            ZEXT416((uint)(fVar161 * fVar161)),ZEXT416(0x40000000));
                  fVar152 = auVar77._0_4_ * 3.0;
                  fVar153 = auVar78._0_4_ * 3.0;
                  fVar160 = fVar161 * fVar161 * 3.0;
                  auVar194._0_4_ = fVar160 * (float)local_5b0._0_4_;
                  auVar194._4_4_ = fVar160 * (float)local_5b0._4_4_;
                  auVar194._8_4_ = fVar160 * (float)uStack_5a8;
                  auVar194._12_4_ = fVar160 * uStack_5a8._4_4_;
                  auVar198 = ZEXT1664(auVar194);
                  auVar167._4_4_ = fVar153;
                  auVar167._0_4_ = fVar153;
                  auVar167._8_4_ = fVar153;
                  auVar167._12_4_ = fVar153;
                  auVar77 = vfmadd132ps_fma(auVar167,auVar194,local_5d0);
                  auVar177._4_4_ = fVar152;
                  auVar177._0_4_ = fVar152;
                  auVar177._8_4_ = fVar152;
                  auVar177._12_4_ = fVar152;
                  auVar77 = vfmadd132ps_fma(auVar177,auVar77,local_5c0);
                  auVar168._4_4_ = fVar151;
                  auVar168._0_4_ = fVar151;
                  auVar168._8_4_ = fVar151;
                  auVar168._12_4_ = fVar151;
                  auVar77 = vfmadd132ps_fma(auVar168,auVar77,local_5a0);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar64 * 4);
                  *(int *)(ray + k * 4 + 0xc0) = auVar77._0_4_;
                  uVar9 = vextractps_avx(auVar77,1);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                  uVar9 = vextractps_avx(auVar77,2);
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar9;
                  *(float *)(ray + k * 4 + 0xf0) = fVar161;
                  *(undefined4 *)(ray + k * 4 + 0x100) = uVar134;
                  *(uint *)(ray + k * 4 + 0x110) = uVar7;
                  *(uint *)(ray + k * 4 + 0x120) = uVar70;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
              }
            }
          }
        }
      }
LAB_01becb7f:
      if (8 < iVar8) {
        local_4c0 = vpbroadcastd_avx512vl();
        local_3e0 = local_500._0_4_;
        uStack_3dc = local_500._0_4_;
        uStack_3d8 = local_500._0_4_;
        uStack_3d4 = local_500._0_4_;
        uStack_3d0 = local_500._0_4_;
        uStack_3cc = local_500._0_4_;
        uStack_3c8 = local_500._0_4_;
        uStack_3c4 = local_500._0_4_;
        uStack_49c = local_4a0;
        uStack_498 = local_4a0;
        uStack_494 = local_4a0;
        uStack_490 = local_4a0;
        uStack_48c = local_4a0;
        uStack_488 = local_4a0;
        uStack_484 = local_4a0;
        local_100 = 1.0 / (float)local_550._0_4_;
        fStack_fc = local_100;
        fStack_f8 = local_100;
        fStack_f4 = local_100;
        fStack_f0 = local_100;
        fStack_ec = local_100;
        fStack_e8 = local_100;
        fStack_e4 = local_100;
        local_550 = vpbroadcastd_avx512vl();
        local_540 = vpbroadcastd_avx512vl();
        lVar68 = 8;
LAB_01becc35:
        auVar99 = vpbroadcastd_avx512vl();
        auVar99 = vpor_avx2(auVar99,_DAT_01fe9900);
        uVar27 = vpcmpd_avx512vl(auVar99,local_4c0,1);
        auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar68 * 4 + lVar28);
        auVar100 = *(undefined1 (*) [32])(lVar28 + 0x21aa768 + lVar68 * 4);
        auVar98 = *(undefined1 (*) [32])(lVar28 + 0x21aabec + lVar68 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar28 + 0x21ab070 + lVar68 * 4);
        auVar219._0_4_ = auVar97._0_4_ * (float)local_3a0._0_4_;
        auVar219._4_4_ = auVar97._4_4_ * (float)local_3a0._4_4_;
        auVar219._8_4_ = auVar97._8_4_ * fStack_398;
        auVar219._12_4_ = auVar97._12_4_ * fStack_394;
        auVar219._16_4_ = auVar97._16_4_ * fStack_390;
        auVar219._20_4_ = auVar97._20_4_ * fStack_38c;
        auVar219._28_36_ = auVar198._28_36_;
        auVar219._24_4_ = auVar97._24_4_ * fStack_388;
        auVar198._0_4_ = auVar97._0_4_ * (float)local_3c0._0_4_;
        auVar198._4_4_ = auVar97._4_4_ * (float)local_3c0._4_4_;
        auVar198._8_4_ = auVar97._8_4_ * fStack_3b8;
        auVar198._12_4_ = auVar97._12_4_ * fStack_3b4;
        auVar198._16_4_ = auVar97._16_4_ * fStack_3b0;
        auVar198._20_4_ = auVar97._20_4_ * fStack_3ac;
        auVar198._28_36_ = auVar190._28_36_;
        auVar198._24_4_ = auVar97._24_4_ * fStack_3a8;
        auVar85 = vmulps_avx512vl(local_e0,auVar97);
        auVar86 = vfmadd231ps_avx512vl(auVar219._0_32_,auVar98,local_360);
        auVar96 = vfmadd231ps_avx512vl(auVar198._0_32_,auVar98,local_380);
        auVar85 = vfmadd231ps_avx512vl(auVar85,auVar98,local_c0);
        auVar86 = vfmadd231ps_avx512vl(auVar86,auVar100,local_320);
        auVar96 = vfmadd231ps_avx512vl(auVar96,auVar100,local_340);
        auVar87 = vfmadd231ps_avx512vl(auVar85,auVar100,local_a0);
        auVar77 = vfmadd231ps_fma(auVar86,auVar99,local_2e0);
        auVar198 = ZEXT1664(auVar77);
        auVar78 = vfmadd231ps_fma(auVar96,auVar99,local_300);
        auVar190 = ZEXT1664(auVar78);
        auVar85 = *(undefined1 (*) [32])(bezier_basis1 + lVar68 * 4 + lVar28);
        auVar86 = *(undefined1 (*) [32])(lVar28 + 0x21acb88 + lVar68 * 4);
        auVar90 = vfmadd231ps_avx512vl(auVar87,auVar99,local_80);
        auVar96 = *(undefined1 (*) [32])(lVar28 + 0x21ad00c + lVar68 * 4);
        auVar87 = *(undefined1 (*) [32])(lVar28 + 0x21ad490 + lVar68 * 4);
        auVar204._0_4_ = auVar87._0_4_ * (float)local_3a0._0_4_;
        auVar204._4_4_ = auVar87._4_4_ * (float)local_3a0._4_4_;
        auVar204._8_4_ = auVar87._8_4_ * fStack_398;
        auVar204._12_4_ = auVar87._12_4_ * fStack_394;
        auVar204._16_4_ = auVar87._16_4_ * fStack_390;
        auVar204._20_4_ = auVar87._20_4_ * fStack_38c;
        auVar204._28_36_ = auVar203._28_36_;
        auVar204._24_4_ = auVar87._24_4_ * fStack_388;
        auVar42._4_4_ = auVar87._4_4_ * (float)local_3c0._4_4_;
        auVar42._0_4_ = auVar87._0_4_ * (float)local_3c0._0_4_;
        auVar42._8_4_ = auVar87._8_4_ * fStack_3b8;
        auVar42._12_4_ = auVar87._12_4_ * fStack_3b4;
        auVar42._16_4_ = auVar87._16_4_ * fStack_3b0;
        auVar42._20_4_ = auVar87._20_4_ * fStack_3ac;
        auVar42._24_4_ = auVar87._24_4_ * fStack_3a8;
        auVar42._28_4_ = uStack_3a4;
        auVar88 = vmulps_avx512vl(local_e0,auVar87);
        auVar89 = vfmadd231ps_avx512vl(auVar204._0_32_,auVar96,local_360);
        auVar91 = vfmadd231ps_avx512vl(auVar42,auVar96,local_380);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar96,local_c0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar86,local_320);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar86,local_340);
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar86,local_a0);
        auVar20 = vfmadd231ps_fma(auVar89,auVar85,local_2e0);
        auVar203 = ZEXT1664(auVar20);
        auVar21 = vfmadd231ps_fma(auVar91,auVar85,local_300);
        auVar91 = vfmadd231ps_avx512vl(auVar88,auVar85,local_80);
        auVar92 = vmaxps_avx512vl(auVar90,auVar91);
        auVar88 = vsubps_avx(ZEXT1632(auVar20),ZEXT1632(auVar77));
        auVar89 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar78));
        auVar93 = vmulps_avx512vl(ZEXT1632(auVar78),auVar88);
        auVar94 = vmulps_avx512vl(ZEXT1632(auVar77),auVar89);
        auVar93 = vsubps_avx512vl(auVar93,auVar94);
        auVar94 = vmulps_avx512vl(auVar89,auVar89);
        auVar94 = vfmadd231ps_avx512vl(auVar94,auVar88,auVar88);
        auVar92 = vmulps_avx512vl(auVar92,auVar92);
        auVar92 = vmulps_avx512vl(auVar92,auVar94);
        auVar93 = vmulps_avx512vl(auVar93,auVar93);
        uVar154 = vcmpps_avx512vl(auVar93,auVar92,2);
        bVar72 = (byte)uVar27 & (byte)uVar154;
        if (bVar72 != 0) {
          auVar87 = vmulps_avx512vl(local_180,auVar87);
          auVar96 = vfmadd213ps_avx512vl(auVar96,local_160,auVar87);
          auVar86 = vfmadd213ps_avx512vl(auVar86,local_140,auVar96);
          auVar85 = vfmadd213ps_avx512vl(auVar85,local_120,auVar86);
          auVar97 = vmulps_avx512vl(local_180,auVar97);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_160,auVar97);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar98);
          auVar86 = vfmadd213ps_avx512vl(auVar99,local_120,auVar100);
          auVar99 = *(undefined1 (*) [32])(lVar28 + 0x21ab4f4 + lVar68 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar28 + 0x21ab978 + lVar68 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar28 + 0x21abdfc + lVar68 * 4);
          auVar97 = *(undefined1 (*) [32])(lVar28 + 0x21ac280 + lVar68 * 4);
          auVar96 = vmulps_avx512vl(_local_3a0,auVar97);
          auVar87 = vmulps_avx512vl(_local_3c0,auVar97);
          auVar97 = vmulps_avx512vl(local_180,auVar97);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar98,local_360);
          auVar87 = vfmadd231ps_avx512vl(auVar87,auVar98,local_380);
          auVar98 = vfmadd231ps_avx512vl(auVar97,local_160,auVar98);
          auVar97 = vfmadd231ps_avx512vl(auVar96,auVar100,local_320);
          auVar96 = vfmadd231ps_avx512vl(auVar87,auVar100,local_340);
          auVar100 = vfmadd231ps_avx512vl(auVar98,local_140,auVar100);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar99,local_2e0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar99,local_300);
          auVar87 = vfmadd231ps_avx512vl(auVar100,local_120,auVar99);
          auVar99 = *(undefined1 (*) [32])(lVar28 + 0x21ad914 + lVar68 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar28 + 0x21ae21c + lVar68 * 4);
          auVar98 = *(undefined1 (*) [32])(lVar28 + 0x21ae6a0 + lVar68 * 4);
          auVar92 = vmulps_avx512vl(_local_3a0,auVar98);
          auVar93 = vmulps_avx512vl(_local_3c0,auVar98);
          auVar98 = vmulps_avx512vl(local_180,auVar98);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,local_360);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_380);
          auVar98 = vfmadd231ps_avx512vl(auVar98,local_160,auVar100);
          auVar100 = *(undefined1 (*) [32])(lVar28 + 0x21add98 + lVar68 * 4);
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar100,local_320);
          auVar93 = vfmadd231ps_avx512vl(auVar93,auVar100,local_340);
          auVar100 = vfmadd231ps_avx512vl(auVar98,local_140,auVar100);
          auVar98 = vfmadd231ps_avx512vl(auVar92,auVar99,local_2e0);
          auVar92 = vfmadd231ps_avx512vl(auVar93,auVar99,local_300);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_120,auVar99);
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar97,auVar93);
          vandps_avx512vl(auVar96,auVar93);
          auVar99 = vmaxps_avx(auVar93,auVar93);
          vandps_avx512vl(auVar87,auVar93);
          auVar99 = vmaxps_avx(auVar99,auVar93);
          auVar61._4_4_ = uStack_3dc;
          auVar61._0_4_ = local_3e0;
          auVar61._8_4_ = uStack_3d8;
          auVar61._12_4_ = uStack_3d4;
          auVar61._16_4_ = uStack_3d0;
          auVar61._20_4_ = uStack_3cc;
          auVar61._24_4_ = uStack_3c8;
          auVar61._28_4_ = uStack_3c4;
          uVar64 = vcmpps_avx512vl(auVar99,auVar61,1);
          bVar14 = (bool)((byte)uVar64 & 1);
          auVar112._0_4_ = (float)((uint)bVar14 * auVar88._0_4_ | (uint)!bVar14 * auVar97._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar112._4_4_ = (float)((uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * auVar97._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar112._8_4_ = (float)((uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * auVar97._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar112._12_4_ = (float)((uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * auVar97._12_4_);
          bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar112._16_4_ = (float)((uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * auVar97._16_4_);
          bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar112._20_4_ = (float)((uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * auVar97._20_4_);
          bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar112._24_4_ = (float)((uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * auVar97._24_4_);
          bVar14 = SUB81(uVar64 >> 7,0);
          auVar112._28_4_ = (uint)bVar14 * auVar88._28_4_ | (uint)!bVar14 * auVar97._28_4_;
          bVar14 = (bool)((byte)uVar64 & 1);
          auVar113._0_4_ = (float)((uint)bVar14 * auVar89._0_4_ | (uint)!bVar14 * auVar96._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar113._4_4_ = (float)((uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar96._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar113._8_4_ = (float)((uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar96._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar113._12_4_ = (float)((uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar96._12_4_);
          bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar113._16_4_ = (float)((uint)bVar14 * auVar89._16_4_ | (uint)!bVar14 * auVar96._16_4_);
          bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar113._20_4_ = (float)((uint)bVar14 * auVar89._20_4_ | (uint)!bVar14 * auVar96._20_4_);
          bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar113._24_4_ = (float)((uint)bVar14 * auVar89._24_4_ | (uint)!bVar14 * auVar96._24_4_);
          bVar14 = SUB81(uVar64 >> 7,0);
          auVar113._28_4_ = (uint)bVar14 * auVar89._28_4_ | (uint)!bVar14 * auVar96._28_4_;
          vandps_avx512vl(auVar98,auVar93);
          vandps_avx512vl(auVar92,auVar93);
          auVar99 = vmaxps_avx(auVar113,auVar113);
          vandps_avx512vl(auVar100,auVar93);
          auVar99 = vmaxps_avx(auVar99,auVar113);
          uVar64 = vcmpps_avx512vl(auVar99,auVar61,1);
          bVar14 = (bool)((byte)uVar64 & 1);
          auVar114._0_4_ = (uint)bVar14 * auVar88._0_4_ | (uint)!bVar14 * auVar98._0_4_;
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar114._4_4_ = (uint)bVar14 * auVar88._4_4_ | (uint)!bVar14 * auVar98._4_4_;
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar114._8_4_ = (uint)bVar14 * auVar88._8_4_ | (uint)!bVar14 * auVar98._8_4_;
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar114._12_4_ = (uint)bVar14 * auVar88._12_4_ | (uint)!bVar14 * auVar98._12_4_;
          bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar114._16_4_ = (uint)bVar14 * auVar88._16_4_ | (uint)!bVar14 * auVar98._16_4_;
          bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar114._20_4_ = (uint)bVar14 * auVar88._20_4_ | (uint)!bVar14 * auVar98._20_4_;
          bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar114._24_4_ = (uint)bVar14 * auVar88._24_4_ | (uint)!bVar14 * auVar98._24_4_;
          bVar14 = SUB81(uVar64 >> 7,0);
          auVar114._28_4_ = (uint)bVar14 * auVar88._28_4_ | (uint)!bVar14 * auVar98._28_4_;
          bVar14 = (bool)((byte)uVar64 & 1);
          auVar115._0_4_ = (float)((uint)bVar14 * auVar89._0_4_ | (uint)!bVar14 * auVar92._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar14 * auVar89._4_4_ | (uint)!bVar14 * auVar92._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar14 * auVar89._8_4_ | (uint)!bVar14 * auVar92._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar14 * auVar89._12_4_ | (uint)!bVar14 * auVar92._12_4_);
          bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar14 * auVar89._16_4_ | (uint)!bVar14 * auVar92._16_4_);
          bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar14 * auVar89._20_4_ | (uint)!bVar14 * auVar92._20_4_);
          bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar14 * auVar89._24_4_ | (uint)!bVar14 * auVar92._24_4_);
          bVar14 = SUB81(uVar64 >> 7,0);
          auVar115._28_4_ = (uint)bVar14 * auVar89._28_4_ | (uint)!bVar14 * auVar92._28_4_;
          auVar208._8_4_ = 0x80000000;
          auVar208._0_8_ = 0x8000000080000000;
          auVar208._12_4_ = 0x80000000;
          auVar208._16_4_ = 0x80000000;
          auVar208._20_4_ = 0x80000000;
          auVar208._24_4_ = 0x80000000;
          auVar208._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar114,auVar208);
          auVar84 = vxorps_avx512vl(auVar93._0_16_,auVar93._0_16_);
          auVar100 = vfmadd213ps_avx512vl(auVar112,auVar112,ZEXT1632(auVar84));
          auVar22 = vfmadd231ps_fma(auVar100,auVar113,auVar113);
          auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar22));
          auVar217._8_4_ = 0xbf000000;
          auVar217._0_8_ = 0xbf000000bf000000;
          auVar217._12_4_ = 0xbf000000;
          auVar217._16_4_ = 0xbf000000;
          auVar217._20_4_ = 0xbf000000;
          auVar217._24_4_ = 0xbf000000;
          auVar217._28_4_ = 0xbf000000;
          fVar161 = auVar100._0_4_;
          fVar151 = auVar100._4_4_;
          fVar152 = auVar100._8_4_;
          fVar153 = auVar100._12_4_;
          fVar160 = auVar100._16_4_;
          fVar173 = auVar100._20_4_;
          fVar75 = auVar100._24_4_;
          auVar43._4_4_ = fVar151 * fVar151 * fVar151 * auVar22._4_4_ * -0.5;
          auVar43._0_4_ = fVar161 * fVar161 * fVar161 * auVar22._0_4_ * -0.5;
          auVar43._8_4_ = fVar152 * fVar152 * fVar152 * auVar22._8_4_ * -0.5;
          auVar43._12_4_ = fVar153 * fVar153 * fVar153 * auVar22._12_4_ * -0.5;
          auVar43._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
          auVar43._20_4_ = fVar173 * fVar173 * fVar173 * -0.0;
          auVar43._24_4_ = fVar75 * fVar75 * fVar75 * -0.0;
          auVar43._28_4_ = auVar113._28_4_;
          auVar98 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar100 = vfmadd231ps_avx512vl(auVar43,auVar98,auVar100);
          auVar44._4_4_ = auVar113._4_4_ * auVar100._4_4_;
          auVar44._0_4_ = auVar113._0_4_ * auVar100._0_4_;
          auVar44._8_4_ = auVar113._8_4_ * auVar100._8_4_;
          auVar44._12_4_ = auVar113._12_4_ * auVar100._12_4_;
          auVar44._16_4_ = auVar113._16_4_ * auVar100._16_4_;
          auVar44._20_4_ = auVar113._20_4_ * auVar100._20_4_;
          auVar44._24_4_ = auVar113._24_4_ * auVar100._24_4_;
          auVar44._28_4_ = 0;
          auVar45._4_4_ = auVar100._4_4_ * -auVar112._4_4_;
          auVar45._0_4_ = auVar100._0_4_ * -auVar112._0_4_;
          auVar45._8_4_ = auVar100._8_4_ * -auVar112._8_4_;
          auVar45._12_4_ = auVar100._12_4_ * -auVar112._12_4_;
          auVar45._16_4_ = auVar100._16_4_ * -auVar112._16_4_;
          auVar45._20_4_ = auVar100._20_4_ * -auVar112._20_4_;
          auVar45._24_4_ = auVar100._24_4_ * -auVar112._24_4_;
          auVar45._28_4_ = auVar113._28_4_;
          auVar97 = vmulps_avx512vl(auVar100,ZEXT1632(auVar84));
          auVar87 = ZEXT1632(auVar84);
          auVar100 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar87);
          auVar100 = vfmadd231ps_avx512vl(auVar100,auVar115,auVar115);
          auVar96 = vrsqrt14ps_avx512vl(auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar217);
          fVar161 = auVar96._0_4_;
          fVar151 = auVar96._4_4_;
          fVar152 = auVar96._8_4_;
          fVar153 = auVar96._12_4_;
          fVar160 = auVar96._16_4_;
          fVar173 = auVar96._20_4_;
          fVar75 = auVar96._24_4_;
          auVar46._4_4_ = fVar151 * fVar151 * fVar151 * auVar100._4_4_;
          auVar46._0_4_ = fVar161 * fVar161 * fVar161 * auVar100._0_4_;
          auVar46._8_4_ = fVar152 * fVar152 * fVar152 * auVar100._8_4_;
          auVar46._12_4_ = fVar153 * fVar153 * fVar153 * auVar100._12_4_;
          auVar46._16_4_ = fVar160 * fVar160 * fVar160 * auVar100._16_4_;
          auVar46._20_4_ = fVar173 * fVar173 * fVar173 * auVar100._20_4_;
          auVar46._24_4_ = fVar75 * fVar75 * fVar75 * auVar100._24_4_;
          auVar46._28_4_ = auVar100._28_4_;
          auVar100 = vfmadd231ps_avx512vl(auVar46,auVar98,auVar96);
          auVar47._4_4_ = auVar115._4_4_ * auVar100._4_4_;
          auVar47._0_4_ = auVar115._0_4_ * auVar100._0_4_;
          auVar47._8_4_ = auVar115._8_4_ * auVar100._8_4_;
          auVar47._12_4_ = auVar115._12_4_ * auVar100._12_4_;
          auVar47._16_4_ = auVar115._16_4_ * auVar100._16_4_;
          auVar47._20_4_ = auVar115._20_4_ * auVar100._20_4_;
          auVar47._24_4_ = auVar115._24_4_ * auVar100._24_4_;
          auVar47._28_4_ = auVar96._28_4_;
          auVar48._4_4_ = auVar100._4_4_ * auVar99._4_4_;
          auVar48._0_4_ = auVar100._0_4_ * auVar99._0_4_;
          auVar48._8_4_ = auVar100._8_4_ * auVar99._8_4_;
          auVar48._12_4_ = auVar100._12_4_ * auVar99._12_4_;
          auVar48._16_4_ = auVar100._16_4_ * auVar99._16_4_;
          auVar48._20_4_ = auVar100._20_4_ * auVar99._20_4_;
          auVar48._24_4_ = auVar100._24_4_ * auVar99._24_4_;
          auVar48._28_4_ = auVar99._28_4_;
          auVar99 = vmulps_avx512vl(auVar100,auVar87);
          auVar22 = vfmadd213ps_fma(auVar44,auVar90,ZEXT1632(auVar77));
          auVar23 = vfmadd213ps_fma(auVar45,auVar90,ZEXT1632(auVar78));
          auVar98 = vfmadd213ps_avx512vl(auVar97,auVar90,auVar86);
          auVar96 = vfmadd213ps_avx512vl(auVar47,auVar91,ZEXT1632(auVar20));
          auVar25 = vfnmadd213ps_fma(auVar44,auVar90,ZEXT1632(auVar77));
          auVar77 = vfmadd213ps_fma(auVar48,auVar91,ZEXT1632(auVar21));
          auVar26 = vfnmadd213ps_fma(auVar45,auVar90,ZEXT1632(auVar78));
          auVar78 = vfmadd213ps_fma(auVar99,auVar91,auVar85);
          auVar222 = vfnmadd231ps_fma(auVar86,auVar90,auVar97);
          auVar82 = vfnmadd213ps_fma(auVar47,auVar91,ZEXT1632(auVar20));
          auVar220 = vfnmadd213ps_fma(auVar48,auVar91,ZEXT1632(auVar21));
          auVar83 = vfnmadd231ps_fma(auVar85,auVar91,auVar99);
          auVar85 = vsubps_avx512vl(auVar96,ZEXT1632(auVar25));
          auVar99 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar26));
          auVar100 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar222));
          auVar49._4_4_ = auVar99._4_4_ * auVar222._4_4_;
          auVar49._0_4_ = auVar99._0_4_ * auVar222._0_4_;
          auVar49._8_4_ = auVar99._8_4_ * auVar222._8_4_;
          auVar49._12_4_ = auVar99._12_4_ * auVar222._12_4_;
          auVar49._16_4_ = auVar99._16_4_ * 0.0;
          auVar49._20_4_ = auVar99._20_4_ * 0.0;
          auVar49._24_4_ = auVar99._24_4_ * 0.0;
          auVar49._28_4_ = auVar97._28_4_;
          auVar20 = vfmsub231ps_fma(auVar49,ZEXT1632(auVar26),auVar100);
          auVar50._4_4_ = auVar100._4_4_ * auVar25._4_4_;
          auVar50._0_4_ = auVar100._0_4_ * auVar25._0_4_;
          auVar50._8_4_ = auVar100._8_4_ * auVar25._8_4_;
          auVar50._12_4_ = auVar100._12_4_ * auVar25._12_4_;
          auVar50._16_4_ = auVar100._16_4_ * 0.0;
          auVar50._20_4_ = auVar100._20_4_ * 0.0;
          auVar50._24_4_ = auVar100._24_4_ * 0.0;
          auVar50._28_4_ = auVar100._28_4_;
          auVar21 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar222),auVar85);
          auVar51._4_4_ = auVar26._4_4_ * auVar85._4_4_;
          auVar51._0_4_ = auVar26._0_4_ * auVar85._0_4_;
          auVar51._8_4_ = auVar26._8_4_ * auVar85._8_4_;
          auVar51._12_4_ = auVar26._12_4_ * auVar85._12_4_;
          auVar51._16_4_ = auVar85._16_4_ * 0.0;
          auVar51._20_4_ = auVar85._20_4_ * 0.0;
          auVar51._24_4_ = auVar85._24_4_ * 0.0;
          auVar51._28_4_ = auVar85._28_4_;
          auVar24 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar25),auVar99);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar87,ZEXT1632(auVar21));
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar87,ZEXT1632(auVar20));
          auVar93 = ZEXT1632(auVar84);
          uVar64 = vcmpps_avx512vl(auVar99,auVar93,2);
          bVar63 = (byte)uVar64;
          fVar126 = (float)((uint)(bVar63 & 1) * auVar22._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar82._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar128 = (float)((uint)bVar14 * auVar22._4_4_ | (uint)!bVar14 * auVar82._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar131 = (float)((uint)bVar14 * auVar22._8_4_ | (uint)!bVar14 * auVar82._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar132 = (float)((uint)bVar14 * auVar22._12_4_ | (uint)!bVar14 * auVar82._12_4_);
          auVar87 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar131,CONCAT44(fVar128,fVar126))));
          fVar127 = (float)((uint)(bVar63 & 1) * auVar23._0_4_ |
                           (uint)!(bool)(bVar63 & 1) * auVar220._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          fVar130 = (float)((uint)bVar14 * auVar23._4_4_ | (uint)!bVar14 * auVar220._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          fVar129 = (float)((uint)bVar14 * auVar23._8_4_ | (uint)!bVar14 * auVar220._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          fVar133 = (float)((uint)bVar14 * auVar23._12_4_ | (uint)!bVar14 * auVar220._12_4_);
          auVar88 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar129,CONCAT44(fVar130,fVar127))));
          auVar116._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar98._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar83._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar116._4_4_ = (float)((uint)bVar14 * auVar98._4_4_ | (uint)!bVar14 * auVar83._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar116._8_4_ = (float)((uint)bVar14 * auVar98._8_4_ | (uint)!bVar14 * auVar83._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar116._12_4_ = (float)((uint)bVar14 * auVar98._12_4_ | (uint)!bVar14 * auVar83._12_4_);
          fVar152 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar98._16_4_);
          auVar116._16_4_ = fVar152;
          fVar161 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar98._20_4_);
          auVar116._20_4_ = fVar161;
          fVar151 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar98._24_4_);
          auVar116._24_4_ = fVar151;
          iVar1 = (uint)(byte)(uVar64 >> 7) * auVar98._28_4_;
          auVar116._28_4_ = iVar1;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar25),auVar96);
          auVar117._0_4_ =
               (uint)(bVar63 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar20._0_4_;
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar117._4_4_ = (uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar20._4_4_;
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar117._8_4_ = (uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar20._8_4_;
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar117._12_4_ = (uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar20._12_4_;
          auVar117._16_4_ = (uint)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_;
          auVar117._20_4_ = (uint)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_;
          auVar117._24_4_ = (uint)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_;
          auVar117._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar26),ZEXT1632(auVar77));
          auVar118._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar22._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar22._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar22._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar22._12_4_);
          fVar160 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_);
          auVar118._16_4_ = fVar160;
          fVar153 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_);
          auVar118._20_4_ = fVar153;
          fVar173 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_);
          auVar118._24_4_ = fVar173;
          auVar118._28_4_ = (uint)(byte)(uVar64 >> 7) * auVar99._28_4_;
          auVar99 = vblendmps_avx512vl(ZEXT1632(auVar222),ZEXT1632(auVar78));
          auVar119._0_4_ =
               (float)((uint)(bVar63 & 1) * auVar99._0_4_ |
                      (uint)!(bool)(bVar63 & 1) * auVar23._0_4_);
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * auVar23._4_4_);
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * auVar23._8_4_);
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * auVar23._12_4_);
          fVar125 = (float)((uint)((byte)(uVar64 >> 4) & 1) * auVar99._16_4_);
          auVar119._16_4_ = fVar125;
          fVar75 = (float)((uint)((byte)(uVar64 >> 5) & 1) * auVar99._20_4_);
          auVar119._20_4_ = fVar75;
          fVar76 = (float)((uint)((byte)(uVar64 >> 6) & 1) * auVar99._24_4_);
          auVar119._24_4_ = fVar76;
          iVar2 = (uint)(byte)(uVar64 >> 7) * auVar99._28_4_;
          auVar119._28_4_ = iVar2;
          auVar120._0_4_ =
               (uint)(bVar63 & 1) * (int)auVar25._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar96._0_4_;
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          auVar120._4_4_ = (uint)bVar14 * (int)auVar25._4_4_ | (uint)!bVar14 * auVar96._4_4_;
          bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
          auVar120._8_4_ = (uint)bVar14 * (int)auVar25._8_4_ | (uint)!bVar14 * auVar96._8_4_;
          bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar120._12_4_ = (uint)bVar14 * (int)auVar25._12_4_ | (uint)!bVar14 * auVar96._12_4_;
          auVar120._16_4_ = (uint)!(bool)((byte)(uVar64 >> 4) & 1) * auVar96._16_4_;
          auVar120._20_4_ = (uint)!(bool)((byte)(uVar64 >> 5) & 1) * auVar96._20_4_;
          auVar120._24_4_ = (uint)!(bool)((byte)(uVar64 >> 6) & 1) * auVar96._24_4_;
          auVar120._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar96._28_4_;
          bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar64 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar64 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar64 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar64 >> 3) & 1);
          auVar96 = vsubps_avx512vl(auVar120,auVar87);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar26._12_4_ |
                                                   (uint)!bVar18 * auVar77._12_4_,
                                                   CONCAT48((uint)bVar16 * (int)auVar26._8_4_ |
                                                            (uint)!bVar16 * auVar77._8_4_,
                                                            CONCAT44((uint)bVar14 *
                                                                     (int)auVar26._4_4_ |
                                                                     (uint)!bVar14 * auVar77._4_4_,
                                                                     (uint)(bVar63 & 1) *
                                                                     (int)auVar26._0_4_ |
                                                                     (uint)!(bool)(bVar63 & 1) *
                                                                     auVar77._0_4_)))),auVar88);
          auVar198 = ZEXT3264(auVar100);
          auVar98 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar222._12_4_ |
                                                  (uint)!bVar19 * auVar78._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar222._8_4_ |
                                                           (uint)!bVar17 * auVar78._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar222._4_4_ |
                                                                    (uint)!bVar15 * auVar78._4_4_,
                                                                    (uint)(bVar63 & 1) *
                                                                    (int)auVar222._0_4_ |
                                                                    (uint)!(bool)(bVar63 & 1) *
                                                                    auVar78._0_4_)))),auVar116);
          auVar97 = vsubps_avx(auVar87,auVar117);
          auVar203 = ZEXT3264(auVar97);
          auVar85 = vsubps_avx(auVar88,auVar118);
          auVar86 = vsubps_avx(auVar116,auVar119);
          auVar52._4_4_ = auVar98._4_4_ * fVar128;
          auVar52._0_4_ = auVar98._0_4_ * fVar126;
          auVar52._8_4_ = auVar98._8_4_ * fVar131;
          auVar52._12_4_ = auVar98._12_4_ * fVar132;
          auVar52._16_4_ = auVar98._16_4_ * 0.0;
          auVar52._20_4_ = auVar98._20_4_ * 0.0;
          auVar52._24_4_ = auVar98._24_4_ * 0.0;
          auVar52._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar52,auVar116,auVar96);
          auVar182._0_4_ = fVar127 * auVar96._0_4_;
          auVar182._4_4_ = fVar130 * auVar96._4_4_;
          auVar182._8_4_ = fVar129 * auVar96._8_4_;
          auVar182._12_4_ = fVar133 * auVar96._12_4_;
          auVar182._16_4_ = auVar96._16_4_ * 0.0;
          auVar182._20_4_ = auVar96._20_4_ * 0.0;
          auVar182._24_4_ = auVar96._24_4_ * 0.0;
          auVar182._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar182,auVar87,auVar100);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar93,ZEXT1632(auVar77));
          auVar188._0_4_ = auVar100._0_4_ * auVar116._0_4_;
          auVar188._4_4_ = auVar100._4_4_ * auVar116._4_4_;
          auVar188._8_4_ = auVar100._8_4_ * auVar116._8_4_;
          auVar188._12_4_ = auVar100._12_4_ * auVar116._12_4_;
          auVar188._16_4_ = auVar100._16_4_ * fVar152;
          auVar188._20_4_ = auVar100._20_4_ * fVar161;
          auVar188._24_4_ = auVar100._24_4_ * fVar151;
          auVar188._28_4_ = 0;
          auVar77 = vfmsub231ps_fma(auVar188,auVar88,auVar98);
          auVar89 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar77));
          auVar99 = vmulps_avx512vl(auVar86,auVar117);
          auVar99 = vfmsub231ps_avx512vl(auVar99,auVar97,auVar119);
          auVar53._4_4_ = auVar85._4_4_ * auVar119._4_4_;
          auVar53._0_4_ = auVar85._0_4_ * auVar119._0_4_;
          auVar53._8_4_ = auVar85._8_4_ * auVar119._8_4_;
          auVar53._12_4_ = auVar85._12_4_ * auVar119._12_4_;
          auVar53._16_4_ = auVar85._16_4_ * fVar125;
          auVar53._20_4_ = auVar85._20_4_ * fVar75;
          auVar53._24_4_ = auVar85._24_4_ * fVar76;
          auVar53._28_4_ = iVar2;
          auVar77 = vfmsub231ps_fma(auVar53,auVar118,auVar86);
          auVar189._0_4_ = auVar118._0_4_ * auVar97._0_4_;
          auVar189._4_4_ = auVar118._4_4_ * auVar97._4_4_;
          auVar189._8_4_ = auVar118._8_4_ * auVar97._8_4_;
          auVar189._12_4_ = auVar118._12_4_ * auVar97._12_4_;
          auVar189._16_4_ = fVar160 * auVar97._16_4_;
          auVar189._20_4_ = fVar153 * auVar97._20_4_;
          auVar189._24_4_ = fVar173 * auVar97._24_4_;
          auVar189._28_4_ = 0;
          auVar78 = vfmsub231ps_fma(auVar189,auVar85,auVar117);
          auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar78),auVar93,auVar99);
          auVar92 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar77));
          auVar190 = ZEXT3264(auVar92);
          auVar99 = vmaxps_avx(auVar89,auVar92);
          uVar154 = vcmpps_avx512vl(auVar99,auVar93,2);
          bVar72 = bVar72 & (byte)uVar154;
          if (bVar72 != 0) {
            uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar218._4_4_ = uVar134;
            auVar218._0_4_ = uVar134;
            auVar218._8_4_ = uVar134;
            auVar218._12_4_ = uVar134;
            auVar218._16_4_ = uVar134;
            auVar218._20_4_ = uVar134;
            auVar218._24_4_ = uVar134;
            auVar218._28_4_ = uVar134;
            auVar219 = ZEXT3264(auVar218);
            auVar54._4_4_ = auVar86._4_4_ * auVar100._4_4_;
            auVar54._0_4_ = auVar86._0_4_ * auVar100._0_4_;
            auVar54._8_4_ = auVar86._8_4_ * auVar100._8_4_;
            auVar54._12_4_ = auVar86._12_4_ * auVar100._12_4_;
            auVar54._16_4_ = auVar86._16_4_ * auVar100._16_4_;
            auVar54._20_4_ = auVar86._20_4_ * auVar100._20_4_;
            auVar54._24_4_ = auVar86._24_4_ * auVar100._24_4_;
            auVar54._28_4_ = auVar99._28_4_;
            auVar21 = vfmsub231ps_fma(auVar54,auVar85,auVar98);
            auVar55._4_4_ = auVar98._4_4_ * auVar97._4_4_;
            auVar55._0_4_ = auVar98._0_4_ * auVar97._0_4_;
            auVar55._8_4_ = auVar98._8_4_ * auVar97._8_4_;
            auVar55._12_4_ = auVar98._12_4_ * auVar97._12_4_;
            auVar55._16_4_ = auVar98._16_4_ * auVar97._16_4_;
            auVar55._20_4_ = auVar98._20_4_ * auVar97._20_4_;
            auVar55._24_4_ = auVar98._24_4_ * auVar97._24_4_;
            auVar55._28_4_ = auVar98._28_4_;
            auVar20 = vfmsub231ps_fma(auVar55,auVar96,auVar86);
            auVar56._4_4_ = auVar85._4_4_ * auVar96._4_4_;
            auVar56._0_4_ = auVar85._0_4_ * auVar96._0_4_;
            auVar56._8_4_ = auVar85._8_4_ * auVar96._8_4_;
            auVar56._12_4_ = auVar85._12_4_ * auVar96._12_4_;
            auVar56._16_4_ = auVar85._16_4_ * auVar96._16_4_;
            auVar56._20_4_ = auVar85._20_4_ * auVar96._20_4_;
            auVar56._24_4_ = auVar85._24_4_ * auVar96._24_4_;
            auVar56._28_4_ = auVar85._28_4_;
            auVar22 = vfmsub231ps_fma(auVar56,auVar97,auVar100);
            auVar77 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar20),ZEXT1632(auVar22));
            auVar78 = vfmadd231ps_fma(ZEXT1632(auVar77),ZEXT1632(auVar21),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar99 = vrcp14ps_avx512vl(ZEXT1632(auVar78));
            auVar34._8_4_ = 0x3f800000;
            auVar34._0_8_ = 0x3f8000003f800000;
            auVar34._12_4_ = 0x3f800000;
            auVar34._16_4_ = 0x3f800000;
            auVar34._20_4_ = 0x3f800000;
            auVar34._24_4_ = 0x3f800000;
            auVar34._28_4_ = 0x3f800000;
            auVar100 = vfnmadd213ps_avx512vl(auVar99,ZEXT1632(auVar78),auVar34);
            auVar77 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
            auVar198 = ZEXT1664(auVar77);
            auVar57._4_4_ = auVar22._4_4_ * auVar116._4_4_;
            auVar57._0_4_ = auVar22._0_4_ * auVar116._0_4_;
            auVar57._8_4_ = auVar22._8_4_ * auVar116._8_4_;
            auVar57._12_4_ = auVar22._12_4_ * auVar116._12_4_;
            auVar57._16_4_ = fVar152 * 0.0;
            auVar57._20_4_ = fVar161 * 0.0;
            auVar57._24_4_ = fVar151 * 0.0;
            auVar57._28_4_ = iVar1;
            auVar20 = vfmadd231ps_fma(auVar57,auVar88,ZEXT1632(auVar20));
            auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar87,ZEXT1632(auVar21));
            fVar161 = auVar77._0_4_;
            fVar151 = auVar77._4_4_;
            fVar152 = auVar77._8_4_;
            fVar153 = auVar77._12_4_;
            local_520._28_4_ = auVar99._28_4_;
            local_520._0_28_ =
                 ZEXT1628(CONCAT412(auVar20._12_4_ * fVar153,
                                    CONCAT48(auVar20._8_4_ * fVar152,
                                             CONCAT44(auVar20._4_4_ * fVar151,
                                                      auVar20._0_4_ * fVar161))));
            auVar203 = ZEXT3264(local_520);
            uVar154 = vcmpps_avx512vl(local_520,auVar218,2);
            auVar60._4_4_ = uStack_49c;
            auVar60._0_4_ = local_4a0;
            auVar60._8_4_ = uStack_498;
            auVar60._12_4_ = uStack_494;
            auVar60._16_4_ = uStack_490;
            auVar60._20_4_ = uStack_48c;
            auVar60._24_4_ = uStack_488;
            auVar60._28_4_ = uStack_484;
            uVar27 = vcmpps_avx512vl(local_520,auVar60,0xd);
            bVar72 = (byte)uVar154 & (byte)uVar27 & bVar72;
            if (bVar72 != 0) {
              uVar73 = vcmpps_avx512vl(ZEXT1632(auVar78),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar73 = bVar72 & uVar73;
              if ((char)uVar73 != '\0') {
                fVar160 = auVar89._0_4_ * fVar161;
                fVar173 = auVar89._4_4_ * fVar151;
                auVar58._4_4_ = fVar173;
                auVar58._0_4_ = fVar160;
                fVar75 = auVar89._8_4_ * fVar152;
                auVar58._8_4_ = fVar75;
                fVar76 = auVar89._12_4_ * fVar153;
                auVar58._12_4_ = fVar76;
                fVar125 = auVar89._16_4_ * 0.0;
                auVar58._16_4_ = fVar125;
                fVar126 = auVar89._20_4_ * 0.0;
                auVar58._20_4_ = fVar126;
                fVar127 = auVar89._24_4_ * 0.0;
                auVar58._24_4_ = fVar127;
                auVar58._28_4_ = auVar89._28_4_;
                auVar172._8_4_ = 0x3f800000;
                auVar172._0_8_ = 0x3f8000003f800000;
                auVar172._12_4_ = 0x3f800000;
                auVar172._16_4_ = 0x3f800000;
                auVar172._20_4_ = 0x3f800000;
                auVar172._24_4_ = 0x3f800000;
                auVar172._28_4_ = 0x3f800000;
                auVar99 = vsubps_avx(auVar172,auVar58);
                local_2c0._0_4_ =
                     (float)((uint)(bVar63 & 1) * (int)fVar160 |
                            (uint)!(bool)(bVar63 & 1) * auVar99._0_4_);
                bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar14 * (int)fVar173 | (uint)!bVar14 * auVar99._4_4_);
                bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar14 * (int)fVar75 | (uint)!bVar14 * auVar99._8_4_);
                bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar14 * (int)fVar76 | (uint)!bVar14 * auVar99._12_4_);
                bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar14 * (int)fVar125 | (uint)!bVar14 * auVar99._16_4_);
                bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar14 * (int)fVar126 | (uint)!bVar14 * auVar99._20_4_);
                bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar14 * (int)fVar127 | (uint)!bVar14 * auVar99._24_4_);
                bVar14 = SUB81(uVar64 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar14 * auVar89._28_4_ | (uint)!bVar14 * auVar99._28_4_);
                auVar99 = vsubps_avx(auVar91,auVar90);
                auVar77 = vfmadd213ps_fma(auVar99,local_2c0,auVar90);
                uVar134 = *(undefined4 *)((long)local_5d8->ray_space + k * 4 + -0x10);
                auVar35._4_4_ = uVar134;
                auVar35._0_4_ = uVar134;
                auVar35._8_4_ = uVar134;
                auVar35._12_4_ = uVar134;
                auVar35._16_4_ = uVar134;
                auVar35._20_4_ = uVar134;
                auVar35._24_4_ = uVar134;
                auVar35._28_4_ = uVar134;
                auVar99 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar77._12_4_ + auVar77._12_4_,
                                                             CONCAT48(auVar77._8_4_ + auVar77._8_4_,
                                                                      CONCAT44(auVar77._4_4_ +
                                                                               auVar77._4_4_,
                                                                               auVar77._0_4_ +
                                                                               auVar77._0_4_)))),
                                          auVar35);
                uVar74 = vcmpps_avx512vl(local_520,auVar99,6);
                uVar73 = uVar73 & uVar74;
                bVar72 = (byte)uVar73;
                if (bVar72 != 0) {
                  auVar159._0_4_ = auVar92._0_4_ * fVar161;
                  auVar159._4_4_ = auVar92._4_4_ * fVar151;
                  auVar159._8_4_ = auVar92._8_4_ * fVar152;
                  auVar159._12_4_ = auVar92._12_4_ * fVar153;
                  auVar159._16_4_ = auVar92._16_4_ * 0.0;
                  auVar159._20_4_ = auVar92._20_4_ * 0.0;
                  auVar159._24_4_ = auVar92._24_4_ * 0.0;
                  auVar159._28_4_ = 0;
                  auVar183._8_4_ = 0x3f800000;
                  auVar183._0_8_ = 0x3f8000003f800000;
                  auVar183._12_4_ = 0x3f800000;
                  auVar183._16_4_ = 0x3f800000;
                  auVar183._20_4_ = 0x3f800000;
                  auVar183._24_4_ = 0x3f800000;
                  auVar183._28_4_ = 0x3f800000;
                  auVar99 = vsubps_avx(auVar183,auVar159);
                  auVar121._0_4_ =
                       (uint)(bVar63 & 1) * (int)auVar159._0_4_ |
                       (uint)!(bool)(bVar63 & 1) * auVar99._0_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 1) & 1);
                  auVar121._4_4_ =
                       (uint)bVar14 * (int)auVar159._4_4_ | (uint)!bVar14 * auVar99._4_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 2) & 1);
                  auVar121._8_4_ =
                       (uint)bVar14 * (int)auVar159._8_4_ | (uint)!bVar14 * auVar99._8_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 3) & 1);
                  auVar121._12_4_ =
                       (uint)bVar14 * (int)auVar159._12_4_ | (uint)!bVar14 * auVar99._12_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 4) & 1);
                  auVar121._16_4_ =
                       (uint)bVar14 * (int)auVar159._16_4_ | (uint)!bVar14 * auVar99._16_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 5) & 1);
                  auVar121._20_4_ =
                       (uint)bVar14 * (int)auVar159._20_4_ | (uint)!bVar14 * auVar99._20_4_;
                  bVar14 = (bool)((byte)(uVar64 >> 6) & 1);
                  auVar121._24_4_ =
                       (uint)bVar14 * (int)auVar159._24_4_ | (uint)!bVar14 * auVar99._24_4_;
                  auVar121._28_4_ = (uint)!SUB81(uVar64 >> 7,0) * auVar99._28_4_;
                  auVar36._8_4_ = 0x40000000;
                  auVar36._0_8_ = 0x4000000040000000;
                  auVar36._12_4_ = 0x40000000;
                  auVar36._16_4_ = 0x40000000;
                  auVar36._20_4_ = 0x40000000;
                  auVar36._24_4_ = 0x40000000;
                  auVar36._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar121,auVar183,auVar36);
                  local_280 = local_520;
                  local_260 = (int)lVar68;
                  local_25c = iVar8;
                  local_250 = local_5a0._0_8_;
                  uStack_248 = local_5a0._8_8_;
                  local_240 = local_5c0._0_8_;
                  uStack_238 = local_5c0._8_8_;
                  local_230 = local_5d0._0_8_;
                  uStack_228 = local_5d0._8_8_;
                  local_220 = local_5b0;
                  uStack_218 = uStack_5a8;
                  pGVar69 = (context->scene->geometries).items[uVar70].ptr;
                  if ((pGVar69->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar77 = vcvtsi2ss_avx512f(auVar84,(int)lVar68);
                    fVar161 = auVar77._0_4_;
                    local_200[0] = (fVar161 + local_2c0._0_4_ + 0.0) * local_100;
                    local_200[1] = (fVar161 + local_2c0._4_4_ + 1.0) * fStack_fc;
                    local_200[2] = (fVar161 + local_2c0._8_4_ + 2.0) * fStack_f8;
                    local_200[3] = (fVar161 + local_2c0._12_4_ + 3.0) * fStack_f4;
                    fStack_1f0 = (fVar161 + local_2c0._16_4_ + 4.0) * fStack_f0;
                    fStack_1ec = (fVar161 + local_2c0._20_4_ + 5.0) * fStack_ec;
                    fStack_1e8 = (fVar161 + local_2c0._24_4_ + 6.0) * fStack_e8;
                    fStack_1e4 = fVar161 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_520;
                    auVar146._8_4_ = 0x7f800000;
                    auVar146._0_8_ = 0x7f8000007f800000;
                    auVar146._12_4_ = 0x7f800000;
                    auVar146._16_4_ = 0x7f800000;
                    auVar146._20_4_ = 0x7f800000;
                    auVar146._24_4_ = 0x7f800000;
                    auVar146._28_4_ = 0x7f800000;
                    auVar99 = vblendmps_avx512vl(auVar146,local_520);
                    auVar122._0_4_ =
                         (uint)(bVar72 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar72 & 1) * 0x7f800000
                    ;
                    bVar14 = (bool)((byte)(uVar73 >> 1) & 1);
                    auVar122._4_4_ = (uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar73 >> 2) & 1);
                    auVar122._8_4_ = (uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar73 >> 3) & 1);
                    auVar122._12_4_ = (uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar73 >> 4) & 1);
                    auVar122._16_4_ = (uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar73 >> 5) & 1);
                    auVar122._20_4_ = (uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = (bool)((byte)(uVar73 >> 6) & 1);
                    auVar122._24_4_ = (uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * 0x7f800000;
                    bVar14 = SUB81(uVar73 >> 7,0);
                    auVar122._28_4_ = (uint)bVar14 * auVar99._28_4_ | (uint)!bVar14 * 0x7f800000;
                    auVar99 = vshufps_avx(auVar122,auVar122,0xb1);
                    auVar99 = vminps_avx(auVar122,auVar99);
                    auVar100 = vshufpd_avx(auVar99,auVar99,5);
                    auVar99 = vminps_avx(auVar99,auVar100);
                    auVar100 = vpermpd_avx2(auVar99,0x4e);
                    auVar99 = vminps_avx(auVar99,auVar100);
                    uVar154 = vcmpps_avx512vl(auVar122,auVar99,0);
                    uVar65 = (uint)uVar73;
                    if (((byte)uVar154 & bVar72) != 0) {
                      uVar65 = (uint)((byte)uVar154 & bVar72);
                    }
                    uVar66 = 0;
                    for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                      uVar66 = uVar66 + 1;
                    }
                    uVar64 = (ulong)uVar66;
                    pGVar62 = pGVar69;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar69->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      do {
                        local_558 = pGVar62;
                        local_440 = local_200[uVar64];
                        local_430 = *(undefined4 *)(local_1e0 + uVar64 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar64 * 4);
                        local_588.context = context->user;
                        fVar151 = 1.0 - local_440;
                        fVar161 = fVar151 * fVar151 * -3.0;
                        auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar151 * fVar151)),
                                                  ZEXT416((uint)(local_440 * fVar151)),
                                                  ZEXT416(0xc0000000));
                        auVar78 = vfmsub132ss_fma(ZEXT416((uint)(local_440 * fVar151)),
                                                  ZEXT416((uint)(local_440 * local_440)),
                                                  ZEXT416(0x40000000));
                        fVar151 = auVar77._0_4_ * 3.0;
                        fVar152 = auVar78._0_4_ * 3.0;
                        fVar153 = local_440 * local_440 * 3.0;
                        auVar196._0_4_ = fVar153 * (float)local_5b0._0_4_;
                        auVar196._4_4_ = fVar153 * (float)local_5b0._4_4_;
                        auVar196._8_4_ = fVar153 * (float)uStack_5a8;
                        auVar196._12_4_ = fVar153 * uStack_5a8._4_4_;
                        auVar198 = ZEXT1664(auVar196);
                        auVar139._4_4_ = fVar152;
                        auVar139._0_4_ = fVar152;
                        auVar139._8_4_ = fVar152;
                        auVar139._12_4_ = fVar152;
                        auVar77 = vfmadd132ps_fma(auVar139,auVar196,local_5d0);
                        auVar179._4_4_ = fVar151;
                        auVar179._0_4_ = fVar151;
                        auVar179._8_4_ = fVar151;
                        auVar179._12_4_ = fVar151;
                        auVar77 = vfmadd132ps_fma(auVar179,auVar77,local_5c0);
                        auVar140._4_4_ = fVar161;
                        auVar140._0_4_ = fVar161;
                        auVar140._8_4_ = fVar161;
                        auVar140._12_4_ = fVar161;
                        auVar77 = vfmadd132ps_fma(auVar140,auVar77,local_5a0);
                        local_470 = auVar77._0_4_;
                        local_460 = vshufps_avx(auVar77,auVar77,0x55);
                        auVar190 = ZEXT1664(local_460);
                        local_450 = vshufps_avx(auVar77,auVar77,0xaa);
                        iStack_46c = local_470;
                        iStack_468 = local_470;
                        iStack_464 = local_470;
                        fStack_43c = local_440;
                        fStack_438 = local_440;
                        fStack_434 = local_440;
                        uStack_42c = local_430;
                        uStack_428 = local_430;
                        uStack_424 = local_430;
                        local_420 = local_540._0_8_;
                        uStack_418 = local_540._8_8_;
                        local_410 = local_550;
                        vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                        uStack_3fc = (local_588.context)->instID[0];
                        local_400 = uStack_3fc;
                        uStack_3f8 = uStack_3fc;
                        uStack_3f4 = uStack_3fc;
                        uStack_3f0 = (local_588.context)->instPrimID[0];
                        uStack_3ec = uStack_3f0;
                        uStack_3e8 = uStack_3f0;
                        uStack_3e4 = uStack_3f0;
                        local_5f0 = local_4d0;
                        local_588.valid = (int *)local_5f0;
                        local_588.geometryUserPtr = pGVar69->userPtr;
                        local_588.hit = (RTCHitN *)&local_470;
                        local_588.N = 4;
                        local_500 = auVar219._0_32_;
                        local_588.ray = (RTCRayN *)ray;
                        if (pGVar69->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar190 = ZEXT1664(local_460);
                          auVar198 = ZEXT1664(auVar196);
                          (*pGVar69->intersectionFilterN)(&local_588);
                          auVar203 = ZEXT3264(local_520);
                          auVar219 = ZEXT3264(local_500);
                          pGVar69 = local_558;
                        }
                        uVar74 = vptestmd_avx512vl(local_5f0,local_5f0);
                        if ((uVar74 & 0xf) == 0) {
LAB_01bed7eb:
                          *(int *)(ray + k * 4 + 0x80) = auVar219._0_4_;
                        }
                        else {
                          p_Var13 = context->args->filter;
                          if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar69->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar190 = ZEXT1664(auVar190._0_16_);
                            auVar198 = ZEXT1664(auVar198._0_16_);
                            (*p_Var13)(&local_588);
                            auVar203 = ZEXT3264(local_520);
                            auVar219 = ZEXT3264(local_500);
                            pGVar69 = local_558;
                          }
                          uVar74 = vptestmd_avx512vl(local_5f0,local_5f0);
                          uVar74 = uVar74 & 0xf;
                          bVar72 = (byte)uVar74;
                          if (bVar72 == 0) goto LAB_01bed7eb;
                          iVar1 = *(int *)(local_588.hit + 4);
                          iVar2 = *(int *)(local_588.hit + 8);
                          iVar59 = *(int *)(local_588.hit + 0xc);
                          bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar16 = SUB81(uVar74 >> 3,0);
                          *(uint *)(local_588.ray + 0xc0) =
                               (uint)(bVar72 & 1) * *(int *)local_588.hit |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0xc0);
                          *(uint *)(local_588.ray + 0xc4) =
                               (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_588.ray + 0xc4)
                          ;
                          *(uint *)(local_588.ray + 200) =
                               (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_588.ray + 200);
                          *(uint *)(local_588.ray + 0xcc) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_588.ray + 0xcc);
                          iVar1 = *(int *)(local_588.hit + 0x14);
                          iVar2 = *(int *)(local_588.hit + 0x18);
                          iVar59 = *(int *)(local_588.hit + 0x1c);
                          bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar16 = SUB81(uVar74 >> 3,0);
                          *(uint *)(local_588.ray + 0xd0) =
                               (uint)(bVar72 & 1) * *(int *)(local_588.hit + 0x10) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0xd0);
                          *(uint *)(local_588.ray + 0xd4) =
                               (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_588.ray + 0xd4)
                          ;
                          *(uint *)(local_588.ray + 0xd8) =
                               (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_588.ray + 0xd8)
                          ;
                          *(uint *)(local_588.ray + 0xdc) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_588.ray + 0xdc);
                          iVar1 = *(int *)(local_588.hit + 0x24);
                          iVar2 = *(int *)(local_588.hit + 0x28);
                          iVar59 = *(int *)(local_588.hit + 0x2c);
                          bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar16 = SUB81(uVar74 >> 3,0);
                          *(uint *)(local_588.ray + 0xe0) =
                               (uint)(bVar72 & 1) * *(int *)(local_588.hit + 0x20) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0xe0);
                          *(uint *)(local_588.ray + 0xe4) =
                               (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_588.ray + 0xe4)
                          ;
                          *(uint *)(local_588.ray + 0xe8) =
                               (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_588.ray + 0xe8)
                          ;
                          *(uint *)(local_588.ray + 0xec) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_588.ray + 0xec);
                          iVar1 = *(int *)(local_588.hit + 0x34);
                          iVar2 = *(int *)(local_588.hit + 0x38);
                          iVar59 = *(int *)(local_588.hit + 0x3c);
                          bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar16 = SUB81(uVar74 >> 3,0);
                          *(uint *)(local_588.ray + 0xf0) =
                               (uint)(bVar72 & 1) * *(int *)(local_588.hit + 0x30) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0xf0);
                          *(uint *)(local_588.ray + 0xf4) =
                               (uint)bVar14 * iVar1 | (uint)!bVar14 * *(int *)(local_588.ray + 0xf4)
                          ;
                          *(uint *)(local_588.ray + 0xf8) =
                               (uint)bVar15 * iVar2 | (uint)!bVar15 * *(int *)(local_588.ray + 0xf8)
                          ;
                          *(uint *)(local_588.ray + 0xfc) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_588.ray + 0xfc);
                          iVar1 = *(int *)(local_588.hit + 0x44);
                          iVar2 = *(int *)(local_588.hit + 0x48);
                          iVar59 = *(int *)(local_588.hit + 0x4c);
                          bVar14 = (bool)((byte)(uVar74 >> 1) & 1);
                          bVar15 = (bool)((byte)(uVar74 >> 2) & 1);
                          bVar16 = SUB81(uVar74 >> 3,0);
                          *(uint *)(local_588.ray + 0x100) =
                               (uint)(bVar72 & 1) * *(int *)(local_588.hit + 0x40) |
                               (uint)!(bool)(bVar72 & 1) * *(int *)(local_588.ray + 0x100);
                          *(uint *)(local_588.ray + 0x104) =
                               (uint)bVar14 * iVar1 |
                               (uint)!bVar14 * *(int *)(local_588.ray + 0x104);
                          *(uint *)(local_588.ray + 0x108) =
                               (uint)bVar15 * iVar2 |
                               (uint)!bVar15 * *(int *)(local_588.ray + 0x108);
                          *(uint *)(local_588.ray + 0x10c) =
                               (uint)bVar16 * iVar59 |
                               (uint)!bVar16 * *(int *)(local_588.ray + 0x10c);
                          auVar77 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x110) = auVar77;
                          auVar77 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x120) = auVar77;
                          auVar77 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x130) = auVar77;
                          auVar77 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_588.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_588.ray + 0x140) = auVar77;
                          auVar219 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
                        }
                        bVar72 = ~(byte)(1 << ((uint)uVar64 & 0x1f)) & (byte)uVar73;
                        uVar134 = auVar219._0_4_;
                        auVar147._4_4_ = uVar134;
                        auVar147._0_4_ = uVar134;
                        auVar147._8_4_ = uVar134;
                        auVar147._12_4_ = uVar134;
                        auVar147._16_4_ = uVar134;
                        auVar147._20_4_ = uVar134;
                        auVar147._24_4_ = uVar134;
                        auVar147._28_4_ = uVar134;
                        uVar154 = vcmpps_avx512vl(auVar203._0_32_,auVar147,2);
                        if ((bVar72 & (byte)uVar154) == 0) goto LAB_01bed884;
                        bVar72 = bVar72 & (byte)uVar154;
                        uVar73 = (ulong)bVar72;
                        auVar148._8_4_ = 0x7f800000;
                        auVar148._0_8_ = 0x7f8000007f800000;
                        auVar148._12_4_ = 0x7f800000;
                        auVar148._16_4_ = 0x7f800000;
                        auVar148._20_4_ = 0x7f800000;
                        auVar148._24_4_ = 0x7f800000;
                        auVar148._28_4_ = 0x7f800000;
                        auVar99 = vblendmps_avx512vl(auVar148,auVar203._0_32_);
                        auVar123._0_4_ =
                             (uint)(bVar72 & 1) * auVar99._0_4_ |
                             (uint)!(bool)(bVar72 & 1) * 0x7f800000;
                        bVar14 = (bool)(bVar72 >> 1 & 1);
                        auVar123._4_4_ = (uint)bVar14 * auVar99._4_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar72 >> 2 & 1);
                        auVar123._8_4_ = (uint)bVar14 * auVar99._8_4_ | (uint)!bVar14 * 0x7f800000;
                        bVar14 = (bool)(bVar72 >> 3 & 1);
                        auVar123._12_4_ = (uint)bVar14 * auVar99._12_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar72 >> 4 & 1);
                        auVar123._16_4_ = (uint)bVar14 * auVar99._16_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar72 >> 5 & 1);
                        auVar123._20_4_ = (uint)bVar14 * auVar99._20_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        bVar14 = (bool)(bVar72 >> 6 & 1);
                        auVar123._24_4_ = (uint)bVar14 * auVar99._24_4_ | (uint)!bVar14 * 0x7f800000
                        ;
                        auVar123._28_4_ =
                             (uint)(bVar72 >> 7) * auVar99._28_4_ |
                             (uint)!(bool)(bVar72 >> 7) * 0x7f800000;
                        auVar99 = vshufps_avx(auVar123,auVar123,0xb1);
                        auVar99 = vminps_avx(auVar123,auVar99);
                        auVar100 = vshufpd_avx(auVar99,auVar99,5);
                        auVar99 = vminps_avx(auVar99,auVar100);
                        auVar100 = vpermpd_avx2(auVar99,0x4e);
                        auVar99 = vminps_avx(auVar99,auVar100);
                        uVar154 = vcmpps_avx512vl(auVar123,auVar99,0);
                        bVar63 = (byte)uVar154 & bVar72;
                        if (bVar63 != 0) {
                          bVar72 = bVar63;
                        }
                        uVar65 = 0;
                        for (uVar66 = (uint)bVar72; (uVar66 & 1) == 0;
                            uVar66 = uVar66 >> 1 | 0x80000000) {
                          uVar65 = uVar65 + 1;
                        }
                        uVar64 = (ulong)uVar65;
                        pGVar62 = local_558;
                      } while( true );
                    }
                    fVar161 = local_200[uVar64];
                    uVar134 = *(undefined4 *)(local_1e0 + uVar64 * 4);
                    fVar152 = 1.0 - fVar161;
                    fVar151 = fVar152 * fVar152 * -3.0;
                    auVar190 = ZEXT464((uint)fVar151);
                    auVar77 = vfmadd231ss_fma(ZEXT416((uint)(fVar152 * fVar152)),
                                              ZEXT416((uint)(fVar161 * fVar152)),ZEXT416(0xc0000000)
                                             );
                    auVar78 = vfmsub132ss_fma(ZEXT416((uint)(fVar161 * fVar152)),
                                              ZEXT416((uint)(fVar161 * fVar161)),ZEXT416(0x40000000)
                                             );
                    fVar152 = auVar77._0_4_ * 3.0;
                    fVar153 = auVar78._0_4_ * 3.0;
                    fVar160 = fVar161 * fVar161 * 3.0;
                    auVar195._0_4_ = fVar160 * (float)local_5b0._0_4_;
                    auVar195._4_4_ = fVar160 * (float)local_5b0._4_4_;
                    auVar195._8_4_ = fVar160 * (float)uStack_5a8;
                    auVar195._12_4_ = fVar160 * uStack_5a8._4_4_;
                    auVar198 = ZEXT1664(auVar195);
                    auVar169._4_4_ = fVar153;
                    auVar169._0_4_ = fVar153;
                    auVar169._8_4_ = fVar153;
                    auVar169._12_4_ = fVar153;
                    auVar77 = vfmadd132ps_fma(auVar169,auVar195,local_5d0);
                    auVar178._4_4_ = fVar152;
                    auVar178._0_4_ = fVar152;
                    auVar178._8_4_ = fVar152;
                    auVar178._12_4_ = fVar152;
                    auVar77 = vfmadd132ps_fma(auVar178,auVar77,local_5c0);
                    auVar170._4_4_ = fVar151;
                    auVar170._0_4_ = fVar151;
                    auVar170._8_4_ = fVar151;
                    auVar170._12_4_ = fVar151;
                    auVar77 = vfmadd132ps_fma(auVar170,auVar77,local_5a0);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar64 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar77._0_4_;
                    uVar9 = vextractps_avx(auVar77,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar9;
                    uVar9 = vextractps_avx(auVar77,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar9;
                    *(float *)(ray + k * 4 + 0xf0) = fVar161;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar134;
                    *(uint *)(ray + k * 4 + 0x110) = uVar7;
                    *(uint *)(ray + k * 4 + 0x120) = uVar70;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_01bed4f0;
      }
LAB_01becb89:
      uVar134 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar31._4_4_ = uVar134;
      auVar31._0_4_ = uVar134;
      auVar31._8_4_ = uVar134;
      auVar31._12_4_ = uVar134;
      uVar154 = vcmpps_avx512vl(local_190,auVar31,2);
      uVar70 = (uint)uVar71 & (uint)uVar71 + 0xf & (uint)uVar154;
      uVar71 = (ulong)uVar70;
    } while (uVar70 != 0);
  }
  return;
LAB_01bed884:
  auVar77 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar221 = ZEXT1664(auVar77);
  auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbeaaaaab));
  auVar223 = ZEXT1664(auVar77);
LAB_01bed4f0:
  lVar68 = lVar68 + 8;
  if (iVar8 <= (int)lVar68) goto LAB_01becb89;
  goto LAB_01becc35;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }